

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::forward
          (DeconvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  int *piVar8;
  size_t sVar9;
  void *pvVar10;
  void *pvVar11;
  _func_int **pp_Var12;
  Layer *pLVar13;
  bool bVar14;
  byte bVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [32];
  float afVar34 [16];
  float afVar35 [16];
  float afVar36 [16];
  float afVar37 [16];
  float afVar38 [16];
  float afVar39 [16];
  float afVar40 [16];
  float afVar41 [16];
  float afVar42 [16];
  float afVar43 [16];
  float afVar44 [16];
  float afVar45 [16];
  float afVar46 [16];
  float afVar47 [16];
  float afVar48 [16];
  float afVar49 [16];
  float afVar50 [16];
  undefined8 uVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  uint uVar59;
  _func_int *p_Var60;
  ulong uVar61;
  long lVar62;
  int iVar63;
  int iVar64;
  ulong uVar65;
  _func_int *p_Var66;
  int iVar67;
  long lVar68;
  int iVar69;
  uint uVar70;
  int iVar71;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar124 [32];
  _func_int ***ppp_Var72;
  int iVar73;
  int iVar74;
  int iVar75;
  undefined1 (*pauVar76) [64];
  size_t sVar77;
  undefined1 (*pauVar78) [32];
  undefined1 (*pauVar79) [16];
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  int iVar83;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar147 [16];
  float fVar145;
  float fVar146;
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  float fVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  v4sf one;
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 in_ZMM30 [64];
  undefined1 auVar193 [64];
  void *local_278;
  _func_int ***local_240;
  undefined1 local_1f8 [56];
  int local_1c0;
  size_t local_1b8;
  long local_1b0;
  Option opt_p;
  Mat local_158;
  Mat m_1;
  Mat m;
  Option opt_g;
  undefined8 uVar6;
  undefined1 auVar123 [32];
  undefined1 auVar99 [16];
  
  auVar96 = in_ZMM30._0_16_;
  iVar54 = bottom_blob->w;
  iVar67 = bottom_blob->h;
  uVar61 = bottom_blob->elemsize;
  iVar55 = bottom_blob->elempack;
  p_Var60 = this->_vptr_DeconvolutionDepthWise_x86_avx512[-3];
  if (opt->use_packing_layout == true) {
    uVar70 = *(uint *)(&this->field_0xd0 + (long)p_Var60);
    if ((uVar70 & 0xf) == 0) {
      uVar70 = 0x10;
    }
    else if ((uVar70 & 7) == 0) {
      uVar70 = 8;
    }
    else {
      uVar70 = (uint)((uVar70 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar70 = 1;
  }
  iVar63 = (*(int *)(&this->field_0xd4 + (long)p_Var60) + -1) *
           *(int *)(&this->field_0xdc + (long)p_Var60);
  iVar73 = *(int *)(&this->field_0xe4 + (long)p_Var60);
  iVar64 = (*(int *)(&this->field_0xd8 + (long)p_Var60) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var60);
  iVar53 = *(int *)(&this->field_0xe8 + (long)p_Var60);
  iVar69 = *(int *)(&this->field_0xfc + (long)p_Var60);
  iVar52 = *(int *)(&this->field_0x100 + (long)p_Var60);
  uVar59 = bottom_blob->c;
  uVar65 = (ulong)uVar59;
  local_1b8 = 0;
  local_1f8._0_8_ = (Allocator *)0x0;
  local_1f8._8_4_ = 0;
  local_1f8._12_4_ = 0;
  local_1f8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_1f8._24_4_ = 0;
  p_Var66 = this->_vptr_DeconvolutionDepthWise_x86_avx512[-3];
  p_Var60 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_avx512 + (long)p_Var66);
  lVar62 = 0x10;
  local_1f8._32_8_ = local_1f8._0_8_;
  local_1f8._40_4_ = local_1f8._8_4_;
  local_1f8._44_4_ = local_1f8._12_4_;
  local_1f8._48_8_ = local_1f8._16_8_;
  local_1c0 = local_1f8._24_4_;
  if (((((*(int *)(&this->field_0xec + (long)p_Var66) < 1) && (*(int *)(p_Var60 + 0xf0) < 1)) &&
       (*(int *)(p_Var60 + 0xf4) < 1)) && (*(int *)(p_Var60 + 0xf8) < 1)) &&
     ((*(int *)(p_Var60 + 0x104) < 1 || (*(int *)(p_Var60 + 0x108) < 1)))) {
    if ((Mat *)local_1f8 != top_blob) {
      piVar8 = top_blob->refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      local_1f8._0_8_ = top_blob->data;
      local_1f8._8_4_ = SUB84(top_blob->refcount,0);
      local_1f8._12_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_1f8._16_8_ = top_blob->elemsize;
      local_1f8._24_4_ = top_blob->elempack;
      local_1f8._32_8_ = top_blob->allocator;
      uVar3 = top_blob->dims;
      uVar4 = top_blob->w;
      uVar5 = top_blob->h;
      uVar7 = top_blob->d;
      uVar6 = CONCAT44(uVar7,uVar5);
      local_1c0 = top_blob->c;
      local_1b8 = top_blob->cstep;
      p_Var66 = this->_vptr_DeconvolutionDepthWise_x86_avx512[-3];
      local_1f8._40_4_ = uVar3;
      local_1f8._44_4_ = uVar4;
      local_1f8._48_8_ = uVar6;
    }
    p_Var60 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_avx512 + (long)p_Var66);
    lVar62 = 8;
  }
  iVar69 = (iVar54 + -1) * iVar73 + iVar63 + iVar69 + 1;
  iVar73 = (iVar67 + -1) * iVar53 + iVar64 + iVar52 + 1;
  sVar77 = (uVar61 / (ulong)(long)iVar55) * (ulong)uVar70;
  Mat::create((Mat *)local_1f8,iVar69,iVar73,*(int *)(p_Var60 + 0xd0) / (int)uVar70,sVar77,uVar70,
              *(Allocator **)(&opt->lightmode + lVar62));
  uVar51 = local_1f8._0_8_;
  afVar50 = _ps512_cephes_log_p8;
  afVar49 = _ps512_cephes_log_p7;
  afVar48 = _ps512_cephes_log_p6;
  afVar47 = _ps512_cephes_log_p5;
  afVar46 = _ps512_cephes_log_p4;
  afVar45 = _ps512_cephes_log_p3;
  afVar44 = _ps512_cephes_log_p2;
  afVar43 = _ps512_cephes_exp_p5;
  afVar42 = _ps512_cephes_exp_p4;
  afVar41 = _ps512_cephes_exp_p3;
  afVar40 = _ps512_cephes_exp_p2;
  afVar39 = _ps512_cephes_exp_p1;
  afVar38 = _ps512_cephes_exp_p0;
  afVar37 = _ps512_cephes_LOG2EF;
  afVar36 = _ps512_exp_lo;
  afVar35 = _ps512_exp_hi;
  afVar34 = _ps512_1;
  if (((Allocator *)local_1f8._0_8_ != (Allocator *)0x0) && ((long)local_1c0 * local_1b8 != 0)) {
    p_Var60 = this->_vptr_DeconvolutionDepthWise_x86_avx512[-3];
    iVar52 = iVar55 * uVar59;
    iVar53 = *(int *)(&this->field_0x114 + (long)p_Var60);
    if ((iVar52 == iVar53) && (iVar52 == *(int *)(&this->field_0xd0 + (long)p_Var60))) {
      iVar53 = *(int *)(&this->field_0xd8 + (long)p_Var60) *
               *(int *)(&this->field_0xd4 + (long)p_Var60);
      if (iVar55 == 1) {
        if (iVar69 < 1) {
          iVar69 = 0;
        }
        if (iVar73 < 1) {
          iVar73 = 0;
        }
        uVar61 = 0;
        if (0 < (int)uVar59) {
          uVar61 = uVar65;
        }
        lVar62 = local_1b8 * local_1f8._16_8_;
        local_278 = (this->weight_data_tm).data;
        iVar55 = bottom_blob->w;
        pvVar10 = bottom_blob->data;
        sVar77 = bottom_blob->elemsize;
        local_1b0 = bottom_blob->cstep * sVar77;
        for (uVar65 = 0; uVar65 != uVar61; uVar65 = uVar65 + 1) {
          local_240 = (_func_int ***)((long)(_func_int ***)uVar51 + lVar62 * uVar65);
          lVar68 = local_1b0 * uVar65;
          for (iVar52 = 0; iVar52 != iVar73; iVar52 = iVar52 + 1) {
            pp_Var12 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
            for (iVar71 = 0; iVar71 != iVar69; iVar71 = iVar71 + 1) {
              p_Var60 = pp_Var12[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var60) == 0) {
                auVar149 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar149 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1b0 + (long)p_Var60) +
                                            uVar65 * 4));
              }
              iVar75 = 0;
              iVar83 = *(int *)(&this->field_0xd8 + (long)p_Var60);
              if (*(int *)(&this->field_0xd8 + (long)p_Var60) < 1) {
                iVar83 = iVar75;
              }
              for (; iVar75 != iVar83; iVar75 = iVar75 + 1) {
                iVar74 = *(int *)(&this->field_0xe0 + (long)p_Var60) * iVar75 + (iVar52 - iVar64);
                if (((-1 < iVar74) &&
                    (iVar56 = iVar74 / *(int *)(&this->field_0xe8 + (long)p_Var60),
                    iVar74 % *(int *)(&this->field_0xe8 + (long)p_Var60) == 0)) && (iVar56 < iVar67)
                   ) {
                  uVar70 = *(uint *)(&this->field_0xd4 + (long)p_Var60);
                  uVar82 = 0;
                  if (0 < (int)uVar70) {
                    uVar82 = (ulong)uVar70;
                  }
                  for (uVar81 = 0; uVar82 != uVar81; uVar81 = uVar81 + 1) {
                    iVar74 = *(int *)(&this->field_0xdc + (long)p_Var60) * (int)uVar81 +
                             (iVar71 - iVar63);
                    if (((-1 < iVar74) &&
                        (iVar57 = iVar74 / *(int *)(&this->field_0xe4 + (long)p_Var60),
                        iVar74 % *(int *)(&this->field_0xe4 + (long)p_Var60) == 0)) &&
                       (iVar57 < iVar54)) {
                      auVar96 = vfmadd231ss_fma(auVar149._0_16_,
                                                ZEXT416(*(uint *)((long)local_278 +
                                                                 uVar81 * 4 +
                                                                 (long)(int)(uVar70 * iVar75) * 4)),
                                                ZEXT416(*(uint *)((long)pvVar10 +
                                                                 (long)iVar57 * 4 +
                                                                 (long)iVar56 *
                                                                 (long)iVar55 * sVar77 + lVar68)));
                      auVar149 = ZEXT1664(auVar96);
                    }
                  }
                }
              }
              auVar96 = auVar149._0_16_;
              fVar145 = auVar149._0_4_;
              fVar146 = fVar145;
              switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var60)) {
              case 1:
                auVar96 = vmaxss_avx(auVar96,ZEXT416(0));
                fVar146 = auVar96._0_4_;
                break;
              case 2:
                uVar16 = vcmpss_avx512f(auVar96,ZEXT416(0),0xe);
                bVar14 = (bool)((byte)uVar16 & 1);
                fVar146 = (float)((uint)bVar14 * 0x3f800000 +
                                 (uint)!bVar14 * **(int **)(&this->field_0x120 + (long)p_Var60)) *
                          fVar145;
                break;
              case 3:
                fVar145 = (float)(*(uint **)(&this->field_0x120 + (long)p_Var60))[1];
                auVar96 = vmaxss_avx(auVar96,ZEXT416(**(uint **)(&this->field_0x120 + (long)p_Var60)
                                                    ));
                fVar146 = auVar96._0_4_;
                if (fVar145 < auVar96._0_4_) {
                  fVar146 = fVar145;
                }
                break;
              case 4:
                auVar96 = vminss_avx(auVar96,SUB6416(ZEXT464(0x42b0c0a5),0));
                auVar85._8_4_ = 0x80000000;
                auVar85._0_8_ = 0x8000000080000000;
                auVar85._12_4_ = 0x80000000;
                auVar84 = vxorps_avx512vl(auVar96,auVar85);
                uVar16 = vcmpss_avx512f(auVar96,ZEXT416(0xc2b0c0a5),1);
                bVar14 = (bool)((byte)uVar16 & 1);
                fVar146 = expf((float)((uint)bVar14 * 0x42b0c0a5 + (uint)!bVar14 * auVar84._0_4_));
                fVar146 = 1.0 / (fVar146 + 1.0);
                break;
              case 5:
                fVar146 = expf(fVar145);
                fVar146 = logf(fVar146 + 1.0);
                fVar146 = tanhf(fVar146);
                fVar146 = fVar146 * fVar145;
                break;
              case 6:
                fVar2 = **(float **)(&this->field_0x120 + (long)p_Var60);
                auVar84._8_4_ = 0x80000000;
                auVar84._0_8_ = 0x8000000080000000;
                auVar84._12_4_ = 0x80000000;
                auVar85 = ZEXT416((uint)(*(float **)(&this->field_0x120 + (long)p_Var60))[1]);
                auVar84 = vxorps_avx512vl(auVar85,auVar84);
                fVar154 = auVar84._0_4_ / fVar2;
                fVar146 = 0.0;
                if ((fVar154 <= fVar145) && (fVar146 = fVar145, fVar145 <= fVar154 + 1.0 / fVar2)) {
                  auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar96,auVar85);
                  fVar146 = auVar96._0_4_ * fVar145;
                }
              }
              *(float *)local_240 = fVar146;
              local_240 = (_func_int ***)((long)local_240 + 4);
            }
          }
          local_278 = (void *)((long)local_278 + (long)iVar53 * 4);
        }
      }
      else if (iVar55 == 0x10) {
        auVar149 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar130 = vxorps_avx512dq(auVar149,(undefined1  [64])_ps512_cephes_log_q2);
        auVar131 = vxorps_avx512dq(auVar149,(undefined1  [64])_ps512_cephes_log_q1);
        auVar132 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
        uVar61 = 0;
        if (iVar69 < 1) {
          iVar69 = 0;
        }
        if (iVar73 < 1) {
          iVar73 = 0;
        }
        if ((int)uVar59 < 1) {
          uVar65 = uVar61;
        }
        auVar133 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar149);
        auVar134 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar96 = vxorps_avx512vl(auVar96,auVar96);
        auVar193 = ZEXT1664(auVar96);
        auVar135 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        for (uVar82 = 0; uVar82 != uVar65; uVar82 = uVar82 + 1) {
          ppp_Var72 = (_func_int ***)
                      ((long)(_func_int ***)local_1f8._0_8_ + local_1b8 * uVar82 * local_1f8._16_8_)
          ;
          iVar55 = bottom_blob->w;
          sVar77 = bottom_blob->cstep;
          sVar9 = bottom_blob->elemsize;
          pvVar10 = bottom_blob->data;
          pvVar11 = (this->weight_data_tm).data;
          for (iVar52 = 0; iVar52 != iVar73; iVar52 = iVar52 + 1) {
            pp_Var12 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
            for (iVar71 = 0; iVar71 != iVar69; iVar71 = iVar71 + 1) {
              p_Var60 = pp_Var12[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var60) == 0) {
                auVar136 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar136 = *(undefined1 (*) [64])
                            (*(long *)(&this->field_0x1b0 + (long)p_Var60) + uVar82 * 0x40);
              }
              iVar75 = 0;
              iVar83 = *(int *)(&this->field_0xd8 + (long)p_Var60);
              if (*(int *)(&this->field_0xd8 + (long)p_Var60) < 1) {
                iVar83 = iVar75;
              }
              for (; iVar75 != iVar83; iVar75 = iVar75 + 1) {
                iVar74 = *(int *)(&this->field_0xe0 + (long)p_Var60) * iVar75 + (iVar52 - iVar64);
                if (((-1 < iVar74) &&
                    (iVar56 = iVar74 / *(int *)(&this->field_0xe8 + (long)p_Var60),
                    iVar74 % *(int *)(&this->field_0xe8 + (long)p_Var60) == 0)) && (iVar56 < iVar67)
                   ) {
                  uVar70 = *(uint *)(&this->field_0xd4 + (long)p_Var60);
                  uVar81 = 0;
                  if (0 < (int)uVar70) {
                    uVar81 = (ulong)uVar70;
                  }
                  pauVar76 = (undefined1 (*) [64])
                             ((long)pvVar11 +
                             (long)(int)(uVar70 * iVar75) * 0x40 + (long)(int)uVar61 * 4);
                  for (uVar80 = 0; uVar81 != uVar80; uVar80 = uVar80 + 1) {
                    iVar74 = *(int *)(&this->field_0xdc + (long)p_Var60) * (int)uVar80 +
                             (iVar71 - iVar63);
                    if (((-1 < iVar74) &&
                        (iVar57 = iVar74 / *(int *)(&this->field_0xe4 + (long)p_Var60),
                        iVar74 % *(int *)(&this->field_0xe4 + (long)p_Var60) == 0)) &&
                       (iVar57 < iVar54)) {
                      auVar136 = vfmadd231ps_avx512f(auVar136,*(undefined1 (*) [64])
                                                               ((long)pvVar10 +
                                                               (long)(iVar57 << 4) * 4 +
                                                               (long)iVar56 * (long)iVar55 * sVar9 +
                                                               sVar77 * uVar82 * sVar9),*pauVar76);
                    }
                    pauVar76 = pauVar76 + 1;
                  }
                }
              }
              switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var60)) {
              case 1:
                auVar136 = vmaxps_avx512f(auVar136,auVar193);
                break;
              case 2:
                uVar81 = vcmpps_avx512f(auVar136,auVar193,1);
                uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var60);
                auVar32._4_4_ = uVar1;
                auVar32._0_4_ = uVar1;
                auVar32._8_4_ = uVar1;
                auVar32._12_4_ = uVar1;
                auVar32._16_4_ = uVar1;
                auVar32._20_4_ = uVar1;
                auVar32._24_4_ = uVar1;
                auVar32._28_4_ = uVar1;
                auVar32._32_4_ = uVar1;
                auVar32._36_4_ = uVar1;
                auVar32._40_4_ = uVar1;
                auVar32._44_4_ = uVar1;
                auVar32._48_4_ = uVar1;
                auVar32._52_4_ = uVar1;
                auVar32._56_4_ = uVar1;
                auVar32._60_4_ = uVar1;
                auVar144 = vmulps_avx512f(auVar136,auVar32);
                bVar14 = (bool)((byte)uVar81 & 1);
                auVar142._0_4_ = (uint)bVar14 * auVar144._0_4_ | (uint)!bVar14 * auVar136._0_4_;
                bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
                auVar142._4_4_ = (uint)bVar14 * auVar144._4_4_ | (uint)!bVar14 * auVar136._4_4_;
                bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                auVar142._8_4_ = (uint)bVar14 * auVar144._8_4_ | (uint)!bVar14 * auVar136._8_4_;
                bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                auVar142._12_4_ = (uint)bVar14 * auVar144._12_4_ | (uint)!bVar14 * auVar136._12_4_;
                bVar14 = (bool)((byte)(uVar81 >> 4) & 1);
                auVar142._16_4_ = (uint)bVar14 * auVar144._16_4_ | (uint)!bVar14 * auVar136._16_4_;
                bVar14 = (bool)((byte)(uVar81 >> 5) & 1);
                auVar142._20_4_ = (uint)bVar14 * auVar144._20_4_ | (uint)!bVar14 * auVar136._20_4_;
                bVar14 = (bool)((byte)(uVar81 >> 6) & 1);
                auVar142._24_4_ = (uint)bVar14 * auVar144._24_4_ | (uint)!bVar14 * auVar136._24_4_;
                bVar14 = (bool)((byte)(uVar81 >> 7) & 1);
                auVar142._28_4_ = (uint)bVar14 * auVar144._28_4_ | (uint)!bVar14 * auVar136._28_4_;
                bVar14 = (bool)((byte)(uVar81 >> 8) & 1);
                auVar142._32_4_ = (uint)bVar14 * auVar144._32_4_ | (uint)!bVar14 * auVar136._32_4_;
                bVar14 = (bool)((byte)(uVar81 >> 9) & 1);
                auVar142._36_4_ = (uint)bVar14 * auVar144._36_4_ | (uint)!bVar14 * auVar136._36_4_;
                bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                auVar142._40_4_ = (uint)bVar14 * auVar144._40_4_ | (uint)!bVar14 * auVar136._40_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xb) & 1);
                auVar142._44_4_ = (uint)bVar14 * auVar144._44_4_ | (uint)!bVar14 * auVar136._44_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xc) & 1);
                auVar142._48_4_ = (uint)bVar14 * auVar144._48_4_ | (uint)!bVar14 * auVar136._48_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xd) & 1);
                auVar142._52_4_ = (uint)bVar14 * auVar144._52_4_ | (uint)!bVar14 * auVar136._52_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xe) & 1);
                auVar142._56_4_ = (uint)bVar14 * auVar144._56_4_ | (uint)!bVar14 * auVar136._56_4_;
                bVar14 = SUB81(uVar81 >> 0xf,0);
                auVar142._60_4_ = (uint)bVar14 * auVar144._60_4_ | (uint)!bVar14 * auVar136._60_4_;
                auVar136 = auVar142;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var60);
                auVar31._4_4_ = uVar1;
                auVar31._0_4_ = uVar1;
                auVar31._8_4_ = uVar1;
                auVar31._12_4_ = uVar1;
                auVar31._16_4_ = uVar1;
                auVar31._20_4_ = uVar1;
                auVar31._24_4_ = uVar1;
                auVar31._28_4_ = uVar1;
                auVar31._32_4_ = uVar1;
                auVar31._36_4_ = uVar1;
                auVar31._40_4_ = uVar1;
                auVar31._44_4_ = uVar1;
                auVar31._48_4_ = uVar1;
                auVar31._52_4_ = uVar1;
                auVar31._56_4_ = uVar1;
                auVar31._60_4_ = uVar1;
                auVar144 = vmaxps_avx512f(auVar136,auVar31);
                uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var60))[1];
                auVar136._4_4_ = uVar1;
                auVar136._0_4_ = uVar1;
                auVar136._8_4_ = uVar1;
                auVar136._12_4_ = uVar1;
                auVar136._16_4_ = uVar1;
                auVar136._20_4_ = uVar1;
                auVar136._24_4_ = uVar1;
                auVar136._28_4_ = uVar1;
                auVar136._32_4_ = uVar1;
                auVar136._36_4_ = uVar1;
                auVar136._40_4_ = uVar1;
                auVar136._44_4_ = uVar1;
                auVar136._48_4_ = uVar1;
                auVar136._52_4_ = uVar1;
                auVar136._56_4_ = uVar1;
                auVar136._60_4_ = uVar1;
                auVar136 = vminps_avx512f(auVar144,auVar136);
                break;
              case 4:
                auVar136 = vxorps_avx512dq(auVar136,auVar149);
                auVar136 = vminps_avx512f(auVar136,(undefined1  [64])afVar35);
                auVar136 = vmaxps_avx512f(auVar136,(undefined1  [64])afVar36);
                auVar144 = vfmadd213ps_avx512f((undefined1  [64])afVar37,auVar136,
                                               (undefined1  [64])afVar43);
                auVar143 = vrndscaleps_avx512f(auVar144,1);
                uVar81 = vcmpps_avx512f(auVar144,auVar143,1);
                auVar144 = vsubps_avx512f(auVar143,(undefined1  [64])afVar34);
                bVar14 = (bool)((byte)uVar81 & 1);
                auVar141._0_4_ = (uint)bVar14 * auVar144._0_4_ | (uint)!bVar14 * auVar143._0_4_;
                bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
                auVar141._4_4_ = (uint)bVar14 * auVar144._4_4_ | (uint)!bVar14 * auVar143._4_4_;
                bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                auVar141._8_4_ = (uint)bVar14 * auVar144._8_4_ | (uint)!bVar14 * auVar143._8_4_;
                bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                auVar141._12_4_ = (uint)bVar14 * auVar144._12_4_ | (uint)!bVar14 * auVar143._12_4_;
                bVar14 = (bool)((byte)(uVar81 >> 4) & 1);
                auVar141._16_4_ = (uint)bVar14 * auVar144._16_4_ | (uint)!bVar14 * auVar143._16_4_;
                bVar14 = (bool)((byte)(uVar81 >> 5) & 1);
                auVar141._20_4_ = (uint)bVar14 * auVar144._20_4_ | (uint)!bVar14 * auVar143._20_4_;
                bVar14 = (bool)((byte)(uVar81 >> 6) & 1);
                auVar141._24_4_ = (uint)bVar14 * auVar144._24_4_ | (uint)!bVar14 * auVar143._24_4_;
                bVar14 = (bool)((byte)(uVar81 >> 7) & 1);
                auVar141._28_4_ = (uint)bVar14 * auVar144._28_4_ | (uint)!bVar14 * auVar143._28_4_;
                bVar14 = (bool)((byte)(uVar81 >> 8) & 1);
                auVar141._32_4_ = (uint)bVar14 * auVar144._32_4_ | (uint)!bVar14 * auVar143._32_4_;
                bVar14 = (bool)((byte)(uVar81 >> 9) & 1);
                auVar141._36_4_ = (uint)bVar14 * auVar144._36_4_ | (uint)!bVar14 * auVar143._36_4_;
                bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                auVar141._40_4_ = (uint)bVar14 * auVar144._40_4_ | (uint)!bVar14 * auVar143._40_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xb) & 1);
                auVar141._44_4_ = (uint)bVar14 * auVar144._44_4_ | (uint)!bVar14 * auVar143._44_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xc) & 1);
                auVar141._48_4_ = (uint)bVar14 * auVar144._48_4_ | (uint)!bVar14 * auVar143._48_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xd) & 1);
                auVar141._52_4_ = (uint)bVar14 * auVar144._52_4_ | (uint)!bVar14 * auVar143._52_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xe) & 1);
                auVar141._56_4_ = (uint)bVar14 * auVar144._56_4_ | (uint)!bVar14 * auVar143._56_4_;
                bVar14 = SUB81(uVar81 >> 0xf,0);
                auVar141._60_4_ = (uint)bVar14 * auVar144._60_4_ | (uint)!bVar14 * auVar143._60_4_;
                auVar136 = vfmadd231ps_avx512f(auVar136,auVar141,auVar130);
                auVar136 = vfmadd231ps_avx512f(auVar136,auVar141,auVar131);
                auVar144 = vmulps_avx512f(auVar136,auVar136);
                auVar143 = vfmadd213ps_avx512f(auVar136,(undefined1  [64])afVar38,
                                               (undefined1  [64])afVar39);
                auVar143 = vfmadd213ps_avx512f(auVar143,auVar136,(undefined1  [64])afVar40);
                auVar143 = vfmadd213ps_avx512f(auVar143,auVar136,(undefined1  [64])afVar41);
                auVar143 = vfmadd213ps_avx512f(auVar143,auVar136,(undefined1  [64])afVar42);
                auVar143 = vfmadd213ps_avx512f(auVar143,auVar136,(undefined1  [64])afVar43);
                auVar136 = vfmadd213ps_avx512f(auVar143,auVar144,auVar136);
                auVar136 = vaddps_avx512f(auVar136,(undefined1  [64])afVar34);
                auVar144 = vcvttps2dq_avx512f(auVar141);
                auVar144 = vpaddd_avx512f(auVar132,auVar144);
                auVar144 = vpslld_avx512f(auVar144,0x17);
                auVar136 = vfmadd213ps_avx512f(auVar144,auVar136,auVar134);
                auVar144 = vrcp14ps_avx512f(auVar136);
                auVar136 = vfmsub213ps_avx512f(auVar136,auVar144,auVar134);
                auVar136 = vfnmadd132ps_avx512vl(auVar136,auVar144,auVar144);
                break;
              case 5:
                auVar144 = vminps_avx512f(auVar136,(undefined1  [64])afVar35);
                auVar144 = vmaxps_avx512f(auVar144,(undefined1  [64])afVar36);
                auVar143 = vfmadd213ps_avx512f((undefined1  [64])afVar37,auVar144,
                                               (undefined1  [64])afVar43);
                auVar137 = vrndscaleps_avx512f(auVar143,1);
                uVar81 = vcmpps_avx512f(auVar143,auVar137,1);
                auVar138 = vsubps_avx512f(auVar137,(undefined1  [64])afVar34);
                bVar14 = (bool)((byte)uVar81 & 1);
                auVar143._0_4_ = (uint)bVar14 * auVar138._0_4_ | (uint)!bVar14 * auVar137._0_4_;
                bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
                auVar143._4_4_ = (uint)bVar14 * auVar138._4_4_ | (uint)!bVar14 * auVar137._4_4_;
                bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                auVar143._8_4_ = (uint)bVar14 * auVar138._8_4_ | (uint)!bVar14 * auVar137._8_4_;
                bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                auVar143._12_4_ = (uint)bVar14 * auVar138._12_4_ | (uint)!bVar14 * auVar137._12_4_;
                bVar14 = (bool)((byte)(uVar81 >> 4) & 1);
                auVar143._16_4_ = (uint)bVar14 * auVar138._16_4_ | (uint)!bVar14 * auVar137._16_4_;
                bVar14 = (bool)((byte)(uVar81 >> 5) & 1);
                auVar143._20_4_ = (uint)bVar14 * auVar138._20_4_ | (uint)!bVar14 * auVar137._20_4_;
                bVar14 = (bool)((byte)(uVar81 >> 6) & 1);
                auVar143._24_4_ = (uint)bVar14 * auVar138._24_4_ | (uint)!bVar14 * auVar137._24_4_;
                bVar14 = (bool)((byte)(uVar81 >> 7) & 1);
                auVar143._28_4_ = (uint)bVar14 * auVar138._28_4_ | (uint)!bVar14 * auVar137._28_4_;
                bVar14 = (bool)((byte)(uVar81 >> 8) & 1);
                auVar143._32_4_ = (uint)bVar14 * auVar138._32_4_ | (uint)!bVar14 * auVar137._32_4_;
                bVar14 = (bool)((byte)(uVar81 >> 9) & 1);
                auVar143._36_4_ = (uint)bVar14 * auVar138._36_4_ | (uint)!bVar14 * auVar137._36_4_;
                bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                auVar143._40_4_ = (uint)bVar14 * auVar138._40_4_ | (uint)!bVar14 * auVar137._40_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xb) & 1);
                auVar143._44_4_ = (uint)bVar14 * auVar138._44_4_ | (uint)!bVar14 * auVar137._44_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xc) & 1);
                auVar143._48_4_ = (uint)bVar14 * auVar138._48_4_ | (uint)!bVar14 * auVar137._48_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xd) & 1);
                auVar143._52_4_ = (uint)bVar14 * auVar138._52_4_ | (uint)!bVar14 * auVar137._52_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xe) & 1);
                auVar143._56_4_ = (uint)bVar14 * auVar138._56_4_ | (uint)!bVar14 * auVar137._56_4_;
                bVar14 = SUB81(uVar81 >> 0xf,0);
                auVar143._60_4_ = (uint)bVar14 * auVar138._60_4_ | (uint)!bVar14 * auVar137._60_4_;
                auVar144 = vfmadd231ps_avx512f(auVar144,auVar143,auVar130);
                auVar144 = vfmadd231ps_avx512f(auVar144,auVar143,auVar131);
                auVar137 = vmulps_avx512f(auVar144,auVar144);
                auVar138 = vfmadd213ps_avx512f(auVar144,(undefined1  [64])afVar38,
                                               (undefined1  [64])afVar39);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar144,(undefined1  [64])afVar40);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar144,(undefined1  [64])afVar41);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar144,(undefined1  [64])afVar42);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar144,(undefined1  [64])afVar43);
                auVar144 = vfmadd213ps_avx512f(auVar138,auVar137,auVar144);
                auVar144 = vaddps_avx512f(auVar144,(undefined1  [64])afVar34);
                auVar143 = vcvttps2dq_avx512f(auVar143);
                auVar143 = vpaddd_avx512f(auVar132,auVar143);
                auVar143 = vpslld_avx512f(auVar143,0x17);
                auVar144 = vfmadd213ps_avx512f(auVar143,auVar144,auVar134);
                auVar143 = vmaxps_avx512f(auVar144,(undefined1  [64])_ps512_min_norm_pos);
                auVar137 = vpsrld_avx512f(auVar143,0x17);
                auVar143 = vpternlogd_avx512f(auVar143,(undefined1  [64])afVar43,
                                              (undefined1  [64])_ps512_inv_mant_mask,0xec);
                uVar81 = vcmpps_avx512f(auVar143,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                auVar138 = vsubps_avx512f(auVar143,(undefined1  [64])afVar34);
                auVar143 = vaddps_avx512f(auVar138,auVar143);
                bVar14 = (bool)((byte)uVar81 & 1);
                auVar139._0_4_ = (uint)bVar14 * auVar143._0_4_ | (uint)!bVar14 * auVar138._0_4_;
                bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
                auVar139._4_4_ = (uint)bVar14 * auVar143._4_4_ | (uint)!bVar14 * auVar138._4_4_;
                bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                auVar139._8_4_ = (uint)bVar14 * auVar143._8_4_ | (uint)!bVar14 * auVar138._8_4_;
                bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                auVar139._12_4_ = (uint)bVar14 * auVar143._12_4_ | (uint)!bVar14 * auVar138._12_4_;
                bVar14 = (bool)((byte)(uVar81 >> 4) & 1);
                auVar139._16_4_ = (uint)bVar14 * auVar143._16_4_ | (uint)!bVar14 * auVar138._16_4_;
                bVar14 = (bool)((byte)(uVar81 >> 5) & 1);
                auVar139._20_4_ = (uint)bVar14 * auVar143._20_4_ | (uint)!bVar14 * auVar138._20_4_;
                bVar14 = (bool)((byte)(uVar81 >> 6) & 1);
                auVar139._24_4_ = (uint)bVar14 * auVar143._24_4_ | (uint)!bVar14 * auVar138._24_4_;
                bVar14 = (bool)((byte)(uVar81 >> 7) & 1);
                auVar139._28_4_ = (uint)bVar14 * auVar143._28_4_ | (uint)!bVar14 * auVar138._28_4_;
                bVar15 = (byte)(uVar81 >> 8);
                bVar14 = (bool)(bVar15 & 1);
                auVar139._32_4_ = (uint)bVar14 * auVar143._32_4_ | (uint)!bVar14 * auVar138._32_4_;
                bVar14 = (bool)((byte)(uVar81 >> 9) & 1);
                auVar139._36_4_ = (uint)bVar14 * auVar143._36_4_ | (uint)!bVar14 * auVar138._36_4_;
                bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                auVar139._40_4_ = (uint)bVar14 * auVar143._40_4_ | (uint)!bVar14 * auVar138._40_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xb) & 1);
                auVar139._44_4_ = (uint)bVar14 * auVar143._44_4_ | (uint)!bVar14 * auVar138._44_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xc) & 1);
                auVar139._48_4_ = (uint)bVar14 * auVar143._48_4_ | (uint)!bVar14 * auVar138._48_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xd) & 1);
                auVar139._52_4_ = (uint)bVar14 * auVar143._52_4_ | (uint)!bVar14 * auVar138._52_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xe) & 1);
                auVar139._56_4_ = (uint)bVar14 * auVar143._56_4_ | (uint)!bVar14 * auVar138._56_4_;
                bVar14 = SUB81(uVar81 >> 0xf,0);
                auVar139._60_4_ = (uint)bVar14 * auVar143._60_4_ | (uint)!bVar14 * auVar138._60_4_;
                auVar143 = vmulps_avx512f(auVar139,auVar139);
                auVar138 = vfmadd132ps_avx512f(auVar139,(undefined1  [64])_ps512_cephes_log_p1,
                                               (undefined1  [64])_ps512_cephes_log_p0);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar139,(undefined1  [64])afVar44);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar139,(undefined1  [64])afVar45);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar139,(undefined1  [64])afVar46);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar139,(undefined1  [64])afVar47);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar139,(undefined1  [64])afVar48);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar139,(undefined1  [64])afVar49);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar139,(undefined1  [64])afVar50);
                auVar140 = vmulps_avx512f(auVar143,auVar139);
                auVar138 = vfmadd213ps_avx512f(auVar140,auVar138,auVar139);
                uVar80 = vcmpps_avx512f(auVar144,auVar193,2);
                auVar144 = vpsubd_avx512f(auVar137,auVar132);
                auVar144 = vcvtdq2ps_avx512f(auVar144);
                auVar137 = vaddps_avx512f(auVar144,(undefined1  [64])afVar34);
                bVar14 = (bool)((byte)uVar81 & 1);
                auVar140._0_4_ = (uint)bVar14 * auVar144._0_4_ | (uint)!bVar14 * auVar137._0_4_;
                bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
                auVar140._4_4_ = (uint)bVar14 * auVar144._4_4_ | (uint)!bVar14 * auVar137._4_4_;
                bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                auVar140._8_4_ = (uint)bVar14 * auVar144._8_4_ | (uint)!bVar14 * auVar137._8_4_;
                bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                auVar140._12_4_ = (uint)bVar14 * auVar144._12_4_ | (uint)!bVar14 * auVar137._12_4_;
                bVar14 = (bool)((byte)(uVar81 >> 4) & 1);
                auVar140._16_4_ = (uint)bVar14 * auVar144._16_4_ | (uint)!bVar14 * auVar137._16_4_;
                bVar14 = (bool)((byte)(uVar81 >> 5) & 1);
                auVar140._20_4_ = (uint)bVar14 * auVar144._20_4_ | (uint)!bVar14 * auVar137._20_4_;
                bVar14 = (bool)((byte)(uVar81 >> 6) & 1);
                auVar140._24_4_ = (uint)bVar14 * auVar144._24_4_ | (uint)!bVar14 * auVar137._24_4_;
                bVar14 = (bool)((byte)(uVar81 >> 7) & 1);
                auVar140._28_4_ = (uint)bVar14 * auVar144._28_4_ | (uint)!bVar14 * auVar137._28_4_;
                bVar14 = (bool)(bVar15 & 1);
                auVar140._32_4_ = (uint)bVar14 * auVar144._32_4_ | (uint)!bVar14 * auVar137._32_4_;
                bVar14 = (bool)((byte)(uVar81 >> 9) & 1);
                auVar140._36_4_ = (uint)bVar14 * auVar144._36_4_ | (uint)!bVar14 * auVar137._36_4_;
                bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                auVar140._40_4_ = (uint)bVar14 * auVar144._40_4_ | (uint)!bVar14 * auVar137._40_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xb) & 1);
                auVar140._44_4_ = (uint)bVar14 * auVar144._44_4_ | (uint)!bVar14 * auVar137._44_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xc) & 1);
                auVar140._48_4_ = (uint)bVar14 * auVar144._48_4_ | (uint)!bVar14 * auVar137._48_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xd) & 1);
                auVar140._52_4_ = (uint)bVar14 * auVar144._52_4_ | (uint)!bVar14 * auVar137._52_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xe) & 1);
                auVar140._56_4_ = (uint)bVar14 * auVar144._56_4_ | (uint)!bVar14 * auVar137._56_4_;
                bVar14 = SUB81(uVar81 >> 0xf,0);
                auVar140._60_4_ = (uint)bVar14 * auVar144._60_4_ | (uint)!bVar14 * auVar137._60_4_;
                auVar144 = vfmadd231ps_avx512f(auVar138,auVar140,
                                               (undefined1  [64])_ps512_cephes_log_q1);
                auVar144 = vfmadd231ps_avx512f(auVar144,auVar133,auVar143);
                auVar144 = vfmadd231ps_avx512f(auVar144,auVar140,
                                               (undefined1  [64])_ps512_cephes_log_q2);
                auVar144 = vmulps_avx512f(auVar144,auVar135);
                auVar143 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                bVar14 = (bool)((byte)uVar80 & 1);
                auVar137._0_4_ = (uint)bVar14 * auVar143._0_4_ | (uint)!bVar14 * auVar144._0_4_;
                bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar137._4_4_ = (uint)bVar14 * auVar143._4_4_ | (uint)!bVar14 * auVar144._4_4_;
                bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar137._8_4_ = (uint)bVar14 * auVar143._8_4_ | (uint)!bVar14 * auVar144._8_4_;
                bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar137._12_4_ = (uint)bVar14 * auVar143._12_4_ | (uint)!bVar14 * auVar144._12_4_;
                bVar14 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar137._16_4_ = (uint)bVar14 * auVar143._16_4_ | (uint)!bVar14 * auVar144._16_4_;
                bVar14 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar137._20_4_ = (uint)bVar14 * auVar143._20_4_ | (uint)!bVar14 * auVar144._20_4_;
                bVar14 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar137._24_4_ = (uint)bVar14 * auVar143._24_4_ | (uint)!bVar14 * auVar144._24_4_;
                bVar14 = (bool)((byte)(uVar80 >> 7) & 1);
                auVar137._28_4_ = (uint)bVar14 * auVar143._28_4_ | (uint)!bVar14 * auVar144._28_4_;
                bVar14 = (bool)((byte)(uVar80 >> 8) & 1);
                auVar137._32_4_ = (uint)bVar14 * auVar143._32_4_ | (uint)!bVar14 * auVar144._32_4_;
                bVar14 = (bool)((byte)(uVar80 >> 9) & 1);
                auVar137._36_4_ = (uint)bVar14 * auVar143._36_4_ | (uint)!bVar14 * auVar144._36_4_;
                bVar14 = (bool)((byte)(uVar80 >> 10) & 1);
                auVar137._40_4_ = (uint)bVar14 * auVar143._40_4_ | (uint)!bVar14 * auVar144._40_4_;
                bVar14 = (bool)((byte)(uVar80 >> 0xb) & 1);
                auVar137._44_4_ = (uint)bVar14 * auVar143._44_4_ | (uint)!bVar14 * auVar144._44_4_;
                bVar14 = (bool)((byte)(uVar80 >> 0xc) & 1);
                auVar137._48_4_ = (uint)bVar14 * auVar143._48_4_ | (uint)!bVar14 * auVar144._48_4_;
                bVar14 = (bool)((byte)(uVar80 >> 0xd) & 1);
                auVar137._52_4_ = (uint)bVar14 * auVar143._52_4_ | (uint)!bVar14 * auVar144._52_4_;
                bVar14 = (bool)((byte)(uVar80 >> 0xe) & 1);
                auVar137._56_4_ = (uint)bVar14 * auVar143._56_4_ | (uint)!bVar14 * auVar144._56_4_;
                bVar14 = SUB81(uVar80 >> 0xf,0);
                auVar137._60_4_ = (uint)bVar14 * auVar143._60_4_ | (uint)!bVar14 * auVar144._60_4_;
                auVar144 = vminps_avx512f(auVar137,(undefined1  [64])afVar35);
                auVar144 = vmaxps_avx512f(auVar144,(undefined1  [64])afVar36);
                auVar143 = vfmadd213ps_avx512f((undefined1  [64])afVar37,auVar144,
                                               (undefined1  [64])afVar43);
                auVar137 = vrndscaleps_avx512f(auVar143,1);
                uVar81 = vcmpps_avx512f(auVar143,auVar137,1);
                auVar143 = vsubps_avx512f(auVar137,(undefined1  [64])afVar34);
                bVar14 = (bool)((byte)uVar81 & 1);
                auVar138._0_4_ = (uint)bVar14 * auVar143._0_4_ | (uint)!bVar14 * auVar137._0_4_;
                bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
                auVar138._4_4_ = (uint)bVar14 * auVar143._4_4_ | (uint)!bVar14 * auVar137._4_4_;
                bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                auVar138._8_4_ = (uint)bVar14 * auVar143._8_4_ | (uint)!bVar14 * auVar137._8_4_;
                bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                auVar138._12_4_ = (uint)bVar14 * auVar143._12_4_ | (uint)!bVar14 * auVar137._12_4_;
                bVar14 = (bool)((byte)(uVar81 >> 4) & 1);
                auVar138._16_4_ = (uint)bVar14 * auVar143._16_4_ | (uint)!bVar14 * auVar137._16_4_;
                bVar14 = (bool)((byte)(uVar81 >> 5) & 1);
                auVar138._20_4_ = (uint)bVar14 * auVar143._20_4_ | (uint)!bVar14 * auVar137._20_4_;
                bVar14 = (bool)((byte)(uVar81 >> 6) & 1);
                auVar138._24_4_ = (uint)bVar14 * auVar143._24_4_ | (uint)!bVar14 * auVar137._24_4_;
                bVar14 = (bool)((byte)(uVar81 >> 7) & 1);
                auVar138._28_4_ = (uint)bVar14 * auVar143._28_4_ | (uint)!bVar14 * auVar137._28_4_;
                bVar14 = (bool)((byte)(uVar81 >> 8) & 1);
                auVar138._32_4_ = (uint)bVar14 * auVar143._32_4_ | (uint)!bVar14 * auVar137._32_4_;
                bVar14 = (bool)((byte)(uVar81 >> 9) & 1);
                auVar138._36_4_ = (uint)bVar14 * auVar143._36_4_ | (uint)!bVar14 * auVar137._36_4_;
                bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                auVar138._40_4_ = (uint)bVar14 * auVar143._40_4_ | (uint)!bVar14 * auVar137._40_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xb) & 1);
                auVar138._44_4_ = (uint)bVar14 * auVar143._44_4_ | (uint)!bVar14 * auVar137._44_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xc) & 1);
                auVar138._48_4_ = (uint)bVar14 * auVar143._48_4_ | (uint)!bVar14 * auVar137._48_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xd) & 1);
                auVar138._52_4_ = (uint)bVar14 * auVar143._52_4_ | (uint)!bVar14 * auVar137._52_4_;
                bVar14 = (bool)((byte)(uVar81 >> 0xe) & 1);
                auVar138._56_4_ = (uint)bVar14 * auVar143._56_4_ | (uint)!bVar14 * auVar137._56_4_;
                bVar14 = SUB81(uVar81 >> 0xf,0);
                auVar138._60_4_ = (uint)bVar14 * auVar143._60_4_ | (uint)!bVar14 * auVar137._60_4_;
                auVar144 = vfmadd231ps_avx512f(auVar144,auVar138,auVar130);
                auVar144 = vfmadd231ps_avx512f(auVar144,auVar138,auVar131);
                auVar143 = vmulps_avx512f(auVar144,auVar144);
                auVar137 = vfmadd213ps_avx512f(auVar144,(undefined1  [64])afVar38,
                                               (undefined1  [64])afVar39);
                auVar137 = vfmadd213ps_avx512f(auVar137,auVar144,(undefined1  [64])afVar40);
                auVar137 = vfmadd213ps_avx512f(auVar137,auVar144,(undefined1  [64])afVar41);
                auVar137 = vfmadd213ps_avx512f(auVar137,auVar144,(undefined1  [64])afVar42);
                auVar137 = vfmadd213ps_avx512f(auVar137,auVar144,(undefined1  [64])afVar43);
                auVar144 = vfmadd213ps_avx512f(auVar137,auVar143,auVar144);
                auVar144 = vaddps_avx512f(auVar144,(undefined1  [64])afVar34);
                auVar143 = vcvttps2dq_avx512f(auVar138);
                auVar143 = vpaddd_avx512f(auVar143,auVar132);
                auVar143 = vpslld_avx512f(auVar143,0x17);
                auVar144 = vfmadd213ps_avx512f(auVar143,auVar144,auVar134);
                auVar143 = vrcp14ps_avx512f(auVar144);
                auVar144 = vfmsub213ps_avx512f(auVar144,auVar143,auVar134);
                auVar144 = vfnmadd132ps_avx512vl(auVar144,auVar143,auVar143);
                auVar144 = vfnmsub213ps_avx512f(auVar144,auVar135,auVar134);
                auVar136 = vmulps_avx512f(auVar144,auVar136);
                break;
              case 6:
                auVar143 = vbroadcastss_avx512f
                                     (ZEXT416(**(uint **)(&this->field_0x120 + (long)p_Var60)));
                uVar70 = (*(uint **)(&this->field_0x120 + (long)p_Var60))[1];
                auVar144._4_4_ = uVar70;
                auVar144._0_4_ = uVar70;
                auVar144._8_4_ = uVar70;
                auVar144._12_4_ = uVar70;
                auVar144._16_4_ = uVar70;
                auVar144._20_4_ = uVar70;
                auVar144._24_4_ = uVar70;
                auVar144._28_4_ = uVar70;
                auVar144._32_4_ = uVar70;
                auVar144._36_4_ = uVar70;
                auVar144._40_4_ = uVar70;
                auVar144._44_4_ = uVar70;
                auVar144._48_4_ = uVar70;
                auVar144._52_4_ = uVar70;
                auVar144._56_4_ = uVar70;
                auVar144._60_4_ = uVar70;
                auVar144 = vfmadd213ps_avx512f(auVar143,auVar136,auVar144);
                auVar144 = vmaxps_avx512f(auVar144,auVar193);
                auVar144 = vminps_avx512f(auVar144,auVar134);
                auVar136 = vmulps_avx512f(auVar144,auVar136);
              }
              *(undefined1 (*) [64])ppp_Var72 = auVar136;
              ppp_Var72 = ppp_Var72 + 8;
            }
          }
          uVar61 = (ulong)(uint)((int)uVar61 + iVar53 * 0x10);
        }
      }
      else if (iVar55 == 8) {
        uVar61 = 0;
        if (iVar69 < 1) {
          iVar69 = 0;
        }
        if (iVar73 < 1) {
          iVar73 = 0;
        }
        if ((int)uVar59 < 1) {
          uVar65 = uVar61;
        }
        local_1b0 = CONCAT44(local_1b0._4_4_,iVar53 * 8);
        auVar151._8_4_ = 0x42b0c0a5;
        auVar151._0_8_ = 0x42b0c0a542b0c0a5;
        auVar151._12_4_ = 0x42b0c0a5;
        auVar151._16_4_ = 0x42b0c0a5;
        auVar151._20_4_ = 0x42b0c0a5;
        auVar151._24_4_ = 0x42b0c0a5;
        auVar151._28_4_ = 0x42b0c0a5;
        auVar153._8_4_ = 0xc2b0c0a5;
        auVar153._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar153._12_4_ = 0xc2b0c0a5;
        auVar153._16_4_ = 0xc2b0c0a5;
        auVar153._20_4_ = 0xc2b0c0a5;
        auVar153._24_4_ = 0xc2b0c0a5;
        auVar153._28_4_ = 0xc2b0c0a5;
        auVar156._8_4_ = 0x3f000000;
        auVar156._0_8_ = 0x3f0000003f000000;
        auVar156._12_4_ = 0x3f000000;
        auVar156._16_4_ = 0x3f000000;
        auVar156._20_4_ = 0x3f000000;
        auVar156._24_4_ = 0x3f000000;
        auVar156._28_4_ = 0x3f000000;
        auVar158._8_4_ = 0x3fb8aa3b;
        auVar158._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar158._12_4_ = 0x3fb8aa3b;
        auVar158._16_4_ = 0x3fb8aa3b;
        auVar158._20_4_ = 0x3fb8aa3b;
        auVar158._24_4_ = 0x3fb8aa3b;
        auVar158._28_4_ = 0x3fb8aa3b;
        auVar160._8_4_ = 0x3f800000;
        auVar160._0_8_ = 0x3f8000003f800000;
        auVar160._12_4_ = 0x3f800000;
        auVar160._16_4_ = 0x3f800000;
        auVar160._20_4_ = 0x3f800000;
        auVar160._24_4_ = 0x3f800000;
        auVar160._28_4_ = 0x3f800000;
        auVar162._8_4_ = 0x3f318000;
        auVar162._0_8_ = 0x3f3180003f318000;
        auVar162._12_4_ = 0x3f318000;
        auVar162._16_4_ = 0x3f318000;
        auVar162._20_4_ = 0x3f318000;
        auVar162._24_4_ = 0x3f318000;
        auVar162._28_4_ = 0x3f318000;
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar176._8_4_ = 0x3ab743ce;
        auVar176._0_8_ = 0x3ab743ce3ab743ce;
        auVar176._12_4_ = 0x3ab743ce;
        auVar176._16_4_ = 0x3ab743ce;
        auVar176._20_4_ = 0x3ab743ce;
        auVar176._24_4_ = 0x3ab743ce;
        auVar176._28_4_ = 0x3ab743ce;
        auVar178._8_4_ = 0x3c088908;
        auVar178._0_8_ = 0x3c0889083c088908;
        auVar178._12_4_ = 0x3c088908;
        auVar178._16_4_ = 0x3c088908;
        auVar178._20_4_ = 0x3c088908;
        auVar178._24_4_ = 0x3c088908;
        auVar178._28_4_ = 0x3c088908;
        auVar180._8_4_ = 0x3d2aa9c1;
        auVar180._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar180._12_4_ = 0x3d2aa9c1;
        auVar180._16_4_ = 0x3d2aa9c1;
        auVar180._20_4_ = 0x3d2aa9c1;
        auVar180._24_4_ = 0x3d2aa9c1;
        auVar180._28_4_ = 0x3d2aa9c1;
        auVar182._8_4_ = 0x3e2aaaaa;
        auVar182._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar182._12_4_ = 0x3e2aaaaa;
        auVar182._16_4_ = 0x3e2aaaaa;
        auVar182._20_4_ = 0x3e2aaaaa;
        auVar182._24_4_ = 0x3e2aaaaa;
        auVar182._28_4_ = 0x3e2aaaaa;
        auVar184._8_4_ = 0x3f800000;
        auVar184._0_8_ = 0x3f8000003f800000;
        auVar184._12_4_ = 0x3f800000;
        auVar184._16_4_ = 0x3f800000;
        auVar184._20_4_ = 0x3f800000;
        auVar184._24_4_ = 0x3f800000;
        auVar184._28_4_ = 0x3f800000;
        auVar186._8_4_ = 0xb95e8083;
        auVar186._0_8_ = 0xb95e8083b95e8083;
        auVar186._12_4_ = 0xb95e8083;
        auVar186._16_4_ = 0xb95e8083;
        auVar186._20_4_ = 0xb95e8083;
        auVar186._24_4_ = 0xb95e8083;
        auVar186._28_4_ = 0xb95e8083;
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar96 = vxorps_avx512vl(auVar96,auVar96);
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        for (uVar82 = 0; uVar82 != uVar65; uVar82 = uVar82 + 1) {
          ppp_Var72 = (_func_int ***)
                      ((long)(_func_int ***)local_1f8._0_8_ + local_1b8 * uVar82 * local_1f8._16_8_)
          ;
          iVar55 = bottom_blob->w;
          sVar77 = bottom_blob->cstep;
          sVar9 = bottom_blob->elemsize;
          pvVar10 = bottom_blob->data;
          pvVar11 = (this->weight_data_tm).data;
          for (iVar52 = 0; iVar52 != iVar73; iVar52 = iVar52 + 1) {
            pp_Var12 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
            for (iVar71 = 0; iVar71 != iVar69; iVar71 = iVar71 + 1) {
              p_Var60 = pp_Var12[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var60) == 0) {
                auVar149 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar149 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x1b0 + (long)p_Var60) + uVar82 * 0x20)
                                   );
              }
              iVar75 = 0;
              iVar83 = *(int *)(&this->field_0xd8 + (long)p_Var60);
              if (*(int *)(&this->field_0xd8 + (long)p_Var60) < 1) {
                iVar83 = iVar75;
              }
              for (; iVar75 != iVar83; iVar75 = iVar75 + 1) {
                iVar74 = *(int *)(&this->field_0xe0 + (long)p_Var60) * iVar75 + (iVar52 - iVar64);
                if (((-1 < iVar74) &&
                    (iVar56 = iVar74 / *(int *)(&this->field_0xe8 + (long)p_Var60),
                    iVar74 % *(int *)(&this->field_0xe8 + (long)p_Var60) == 0)) && (iVar56 < iVar67)
                   ) {
                  uVar70 = *(uint *)(&this->field_0xd4 + (long)p_Var60);
                  uVar81 = 0;
                  if (0 < (int)uVar70) {
                    uVar81 = (ulong)uVar70;
                  }
                  pauVar78 = (undefined1 (*) [32])
                             ((long)pvVar11 +
                             (long)(int)(uVar70 * iVar75) * 0x20 + (long)(int)uVar61 * 4);
                  for (uVar80 = 0; uVar81 != uVar80; uVar80 = uVar80 + 1) {
                    iVar74 = *(int *)(&this->field_0xdc + (long)p_Var60) * (int)uVar80 +
                             (iVar71 - iVar63);
                    if (((-1 < iVar74) &&
                        (iVar57 = iVar74 / *(int *)(&this->field_0xe4 + (long)p_Var60),
                        iVar74 % *(int *)(&this->field_0xe4 + (long)p_Var60) == 0)) &&
                       (iVar57 < iVar54)) {
                      auVar84 = vfmadd231ps_fma(auVar149._0_32_,
                                                *(undefined1 (*) [32])
                                                 ((long)pvVar10 +
                                                 (long)(iVar57 << 3) * 4 +
                                                 (long)iVar56 * (long)iVar55 * sVar9 +
                                                 sVar77 * uVar82 * sVar9),*pauVar78);
                      auVar149 = ZEXT1664(auVar84);
                    }
                    pauVar78 = pauVar78 + 1;
                  }
                }
              }
              auVar124 = auVar149._0_32_;
              auVar121 = auVar124;
              if (*(int *)(&this->field_0x118 + (long)p_Var60) - 1U < 6) {
                auVar121 = vmaxps_avx512vl(auVar124,ZEXT1632(auVar96));
                switch(*(int *)(&this->field_0x118 + (long)p_Var60)) {
                case 2:
                  auVar124 = vminps_avx512vl(auVar124,ZEXT1632(auVar96));
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var60);
                  auVar30._4_4_ = uVar1;
                  auVar30._0_4_ = uVar1;
                  auVar30._8_4_ = uVar1;
                  auVar30._12_4_ = uVar1;
                  auVar30._16_4_ = uVar1;
                  auVar30._20_4_ = uVar1;
                  auVar30._24_4_ = uVar1;
                  auVar30._28_4_ = uVar1;
                  auVar121 = vfmadd231ps_avx512vl(auVar121,auVar124,auVar30);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var60);
                  auVar28._4_4_ = uVar1;
                  auVar28._0_4_ = uVar1;
                  auVar28._8_4_ = uVar1;
                  auVar28._12_4_ = uVar1;
                  auVar28._16_4_ = uVar1;
                  auVar28._20_4_ = uVar1;
                  auVar28._24_4_ = uVar1;
                  auVar28._28_4_ = uVar1;
                  auVar121 = vmaxps_avx512vl(auVar124,auVar28);
                  uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var60))[1];
                  auVar29._4_4_ = uVar1;
                  auVar29._0_4_ = uVar1;
                  auVar29._8_4_ = uVar1;
                  auVar29._12_4_ = uVar1;
                  auVar29._16_4_ = uVar1;
                  auVar29._20_4_ = uVar1;
                  auVar29._24_4_ = uVar1;
                  auVar29._28_4_ = uVar1;
                  auVar121 = vminps_avx512vl(auVar121,auVar29);
                  break;
                case 4:
                  auVar26._8_4_ = 0x80000000;
                  auVar26._0_8_ = 0x8000000080000000;
                  auVar26._12_4_ = 0x80000000;
                  auVar26._16_4_ = 0x80000000;
                  auVar26._20_4_ = 0x80000000;
                  auVar26._24_4_ = 0x80000000;
                  auVar26._28_4_ = 0x80000000;
                  auVar121 = vxorps_avx512vl(auVar124,auVar26);
                  auVar121 = vminps_avx(auVar121,auVar151);
                  auVar121 = vmaxps_avx(auVar121,auVar153);
                  auVar84 = vfmadd231ps_fma(auVar156,auVar121,auVar158);
                  auVar124 = vroundps_avx(ZEXT1632(auVar84),1);
                  uVar81 = vcmpps_avx512vl(ZEXT1632(auVar84),auVar124,1);
                  auVar122 = vsubps_avx512vl(auVar124,auVar160);
                  bVar14 = (bool)((byte)uVar81 & 1);
                  auVar129._0_4_ =
                       (float)((uint)bVar14 * auVar122._0_4_ | (uint)!bVar14 * auVar124._0_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar129._4_4_ =
                       (float)((uint)bVar14 * auVar122._4_4_ | (uint)!bVar14 * auVar124._4_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar129._8_4_ =
                       (float)((uint)bVar14 * auVar122._8_4_ | (uint)!bVar14 * auVar124._8_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar129._12_4_ =
                       (float)((uint)bVar14 * auVar122._12_4_ | (uint)!bVar14 * auVar124._12_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 4) & 1);
                  auVar129._16_4_ =
                       (float)((uint)bVar14 * auVar122._16_4_ | (uint)!bVar14 * auVar124._16_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 5) & 1);
                  auVar129._20_4_ =
                       (float)((uint)bVar14 * auVar122._20_4_ | (uint)!bVar14 * auVar124._20_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 6) & 1);
                  auVar129._24_4_ =
                       (float)((uint)bVar14 * auVar122._24_4_ | (uint)!bVar14 * auVar124._24_4_);
                  bVar14 = SUB81(uVar81 >> 7,0);
                  auVar129._28_4_ =
                       (float)((uint)bVar14 * auVar122._28_4_ | (uint)!bVar14 * auVar124._28_4_);
                  auVar84 = vfmsub231ps_fma(auVar121,auVar129,auVar162);
                  auVar27._8_4_ = 0x395e8083;
                  auVar27._0_8_ = 0x395e8083395e8083;
                  auVar27._12_4_ = 0x395e8083;
                  auVar27._16_4_ = 0x395e8083;
                  auVar27._20_4_ = 0x395e8083;
                  auVar27._24_4_ = 0x395e8083;
                  auVar27._28_4_ = 0x395e8083;
                  auVar121 = vfmsub231ps_avx512vl(ZEXT1632(auVar84),auVar129,auVar27);
                  auVar167._0_4_ = auVar121._0_4_ * auVar121._0_4_;
                  auVar167._4_4_ = auVar121._4_4_ * auVar121._4_4_;
                  auVar167._8_4_ = auVar121._8_4_ * auVar121._8_4_;
                  auVar167._12_4_ = auVar121._12_4_ * auVar121._12_4_;
                  auVar167._16_4_ = auVar121._16_4_ * auVar121._16_4_;
                  auVar167._20_4_ = auVar121._20_4_ * auVar121._20_4_;
                  auVar167._24_4_ = auVar121._24_4_ * auVar121._24_4_;
                  auVar167._28_4_ = 0;
                  auVar84 = vfmadd213ps_fma(auVar108,auVar121,auVar176);
                  auVar84 = vfmadd213ps_fma(ZEXT1632(auVar84),auVar121,auVar178);
                  auVar84 = vfmadd213ps_fma(ZEXT1632(auVar84),auVar121,auVar180);
                  auVar84 = vfmadd213ps_fma(ZEXT1632(auVar84),auVar121,auVar182);
                  auVar84 = vfmadd213ps_fma(ZEXT1632(auVar84),auVar121,auVar156);
                  auVar84 = vfmadd213ps_fma(ZEXT1632(auVar84),auVar167,auVar121);
                  auVar148._0_4_ = auVar84._0_4_ + 1.0;
                  auVar148._4_4_ = auVar84._4_4_ + 1.0;
                  auVar148._8_4_ = auVar84._8_4_ + 1.0;
                  auVar148._12_4_ = auVar84._12_4_ + 1.0;
                  auVar148._16_4_ = 0x3f800000;
                  auVar148._20_4_ = 0x3f800000;
                  auVar148._24_4_ = 0x3f800000;
                  auVar148._28_4_ = 0x3f800000;
                  auVar168._0_4_ = (int)auVar129._0_4_;
                  auVar168._4_4_ = (int)auVar129._4_4_;
                  auVar168._8_4_ = (int)auVar129._8_4_;
                  auVar168._12_4_ = (int)auVar129._12_4_;
                  auVar168._16_4_ = (int)auVar129._16_4_;
                  auVar168._20_4_ = (int)auVar129._20_4_;
                  auVar168._24_4_ = (int)auVar129._24_4_;
                  auVar168._28_4_ = (int)auVar129._28_4_;
                  auVar121 = vpslld_avx2(auVar168,0x17);
                  auVar121 = vpaddd_avx2(auVar184,auVar121);
                  auVar84 = vfmadd213ps_fma(auVar121,auVar148,auVar160);
                  auVar121 = vrcpps_avx(ZEXT1632(auVar84));
                  auVar84 = vfmsub213ps_fma(ZEXT1632(auVar84),auVar121,auVar160);
                  auVar84 = vfnmadd132ps_fma(ZEXT1632(auVar84),auVar121,auVar121);
                  auVar121 = ZEXT1632(auVar84);
                  break;
                case 5:
                  auVar121 = vminps_avx(auVar124,auVar151);
                  auVar121 = vmaxps_avx(auVar121,auVar153);
                  auVar84 = vfmadd213ps_fma(auVar158,auVar121,auVar156);
                  auVar124 = vroundps_avx(ZEXT1632(auVar84),1);
                  uVar81 = vcmpps_avx512vl(ZEXT1632(auVar84),auVar124,1);
                  auVar122 = vsubps_avx512vl(auVar124,auVar160);
                  bVar14 = (bool)((byte)uVar81 & 1);
                  auVar123._0_4_ =
                       (float)((uint)bVar14 * auVar122._0_4_ | (uint)!bVar14 * auVar124._0_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar123._4_4_ =
                       (float)((uint)bVar14 * auVar122._4_4_ | (uint)!bVar14 * auVar124._4_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar123._8_4_ =
                       (float)((uint)bVar14 * auVar122._8_4_ | (uint)!bVar14 * auVar124._8_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar123._12_4_ =
                       (float)((uint)bVar14 * auVar122._12_4_ | (uint)!bVar14 * auVar124._12_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 4) & 1);
                  auVar123._16_4_ =
                       (float)((uint)bVar14 * auVar122._16_4_ | (uint)!bVar14 * auVar124._16_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 5) & 1);
                  auVar123._20_4_ =
                       (float)((uint)bVar14 * auVar122._20_4_ | (uint)!bVar14 * auVar124._20_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 6) & 1);
                  auVar123._24_4_ =
                       (float)((uint)bVar14 * auVar122._24_4_ | (uint)!bVar14 * auVar124._24_4_);
                  bVar14 = SUB81(uVar81 >> 7,0);
                  auVar123._28_4_ =
                       (float)((uint)bVar14 * auVar122._28_4_ | (uint)!bVar14 * auVar124._28_4_);
                  auVar84 = vfmsub231ps_fma(auVar121,auVar123,auVar162);
                  auVar84 = vfnmsub231ps_fma(ZEXT1632(auVar84),auVar123,auVar186);
                  auVar124 = ZEXT1632(auVar84);
                  auVar121 = vfmadd213ps_avx512vl(auVar108,auVar124,auVar176);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar124,auVar178);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar124,auVar180);
                  auVar124 = ZEXT1632(auVar84);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar124,auVar182);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar124,auVar156);
                  auVar121 = vfmadd213ps_avx512vl
                                       (auVar121,ZEXT1632(CONCAT412(auVar84._12_4_ * auVar84._12_4_,
                                                                    CONCAT48(auVar84._8_4_ *
                                                                             auVar84._8_4_,
                                                                             CONCAT44(auVar84._4_4_
                                                                                      * auVar84.
                                                  _4_4_,auVar84._0_4_ * auVar84._0_4_)))),auVar124);
                  auVar124 = vaddps_avx512vl(auVar121,auVar160);
                  auVar172._0_4_ = (int)auVar123._0_4_;
                  auVar172._4_4_ = (int)auVar123._4_4_;
                  auVar172._8_4_ = (int)auVar123._8_4_;
                  auVar172._12_4_ = (int)auVar123._12_4_;
                  auVar172._16_4_ = (int)auVar123._16_4_;
                  auVar172._20_4_ = (int)auVar123._20_4_;
                  auVar172._24_4_ = (int)auVar123._24_4_;
                  auVar172._28_4_ = (int)auVar123._28_4_;
                  auVar121 = vpslld_avx2(auVar172,0x17);
                  auVar121 = vpaddd_avx2(auVar121,auVar184);
                  auVar84 = vfmadd213ps_fma(auVar121,auVar124,auVar160);
                  uVar81 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar96),2);
                  auVar124._8_4_ = 0x800000;
                  auVar124._0_8_ = 0x80000000800000;
                  auVar124._12_4_ = 0x800000;
                  auVar124._16_4_ = 0x800000;
                  auVar124._20_4_ = 0x800000;
                  auVar124._24_4_ = 0x800000;
                  auVar124._28_4_ = 0x800000;
                  auVar121 = vmaxps_avx512vl(ZEXT1632(auVar84),auVar124);
                  auVar173 = vpsrld_avx2(auVar121,0x17);
                  auVar192._8_4_ = 0x807fffff;
                  auVar192._0_8_ = 0x807fffff807fffff;
                  auVar192._12_4_ = 0x807fffff;
                  auVar192._16_4_ = 0x807fffff;
                  auVar192._20_4_ = 0x807fffff;
                  auVar192._24_4_ = 0x807fffff;
                  auVar192._28_4_ = 0x807fffff;
                  auVar24._8_4_ = 0x3f000000;
                  auVar24._0_8_ = 0x3f0000003f000000;
                  auVar24._12_4_ = 0x3f000000;
                  auVar24._16_4_ = 0x3f000000;
                  auVar24._20_4_ = 0x3f000000;
                  auVar24._24_4_ = 0x3f000000;
                  auVar24._28_4_ = 0x3f000000;
                  auVar121 = vpternlogd_avx512vl(auVar121,auVar192,auVar24,0xea);
                  uVar80 = vcmpps_avx512vl(auVar121,auVar109,1);
                  auVar124 = vaddps_avx512vl(auVar121,auVar110);
                  auVar122 = vaddps_avx512vl(auVar124,auVar121);
                  bVar14 = (bool)((byte)uVar80 & 1);
                  auVar125._0_4_ =
                       (float)((uint)bVar14 * auVar122._0_4_ | (uint)!bVar14 * auVar124._0_4_);
                  bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
                  auVar125._4_4_ =
                       (float)((uint)bVar14 * auVar122._4_4_ | (uint)!bVar14 * auVar124._4_4_);
                  bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                  auVar125._8_4_ =
                       (float)((uint)bVar14 * auVar122._8_4_ | (uint)!bVar14 * auVar124._8_4_);
                  bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
                  auVar125._12_4_ =
                       (float)((uint)bVar14 * auVar122._12_4_ | (uint)!bVar14 * auVar124._12_4_);
                  bVar14 = (bool)((byte)(uVar80 >> 4) & 1);
                  auVar125._16_4_ =
                       (float)((uint)bVar14 * auVar122._16_4_ | (uint)!bVar14 * auVar124._16_4_);
                  bVar14 = (bool)((byte)(uVar80 >> 5) & 1);
                  auVar125._20_4_ =
                       (float)((uint)bVar14 * auVar122._20_4_ | (uint)!bVar14 * auVar124._20_4_);
                  bVar14 = (bool)((byte)(uVar80 >> 6) & 1);
                  auVar125._24_4_ =
                       (float)((uint)bVar14 * auVar122._24_4_ | (uint)!bVar14 * auVar124._24_4_);
                  bVar14 = SUB81(uVar80 >> 7,0);
                  auVar125._28_4_ = (uint)bVar14 * auVar122._28_4_ | (uint)!bVar14 * auVar124._28_4_
                  ;
                  auVar33._4_4_ = auVar125._4_4_ * auVar125._4_4_;
                  auVar33._0_4_ = auVar125._0_4_ * auVar125._0_4_;
                  auVar33._8_4_ = auVar125._8_4_ * auVar125._8_4_;
                  auVar33._12_4_ = auVar125._12_4_ * auVar125._12_4_;
                  auVar33._16_4_ = auVar125._16_4_ * auVar125._16_4_;
                  auVar33._20_4_ = auVar125._20_4_ * auVar125._20_4_;
                  auVar33._24_4_ = auVar125._24_4_ * auVar125._24_4_;
                  auVar33._28_4_ = auVar121._28_4_;
                  auVar121 = vfmadd213ps_avx512vl(auVar111,auVar125,auVar112);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar125,auVar113);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar125,auVar114);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar125,auVar115);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar125,auVar116);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar125,auVar117);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar125,auVar118);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar125,auVar119);
                  auVar124 = vmulps_avx512vl(auVar33,auVar125);
                  auVar124 = vmulps_avx512vl(auVar124,auVar121);
                  auVar25._8_4_ = 0xffffff82;
                  auVar25._0_8_ = 0xffffff82ffffff82;
                  auVar25._12_4_ = 0xffffff82;
                  auVar25._16_4_ = 0xffffff82;
                  auVar25._20_4_ = 0xffffff82;
                  auVar25._24_4_ = 0xffffff82;
                  auVar25._28_4_ = 0xffffff82;
                  auVar121 = vpaddd_avx512vl(auVar173,auVar25);
                  auVar121 = vcvtdq2ps_avx(auVar121);
                  auVar122 = vsubps_avx512vl(auVar121,auVar160);
                  bVar14 = (bool)((byte)uVar80 & 1);
                  auVar126._0_4_ = (uint)bVar14 * auVar122._0_4_ | (uint)!bVar14 * auVar121._0_4_;
                  bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
                  auVar126._4_4_ = (uint)bVar14 * auVar122._4_4_ | (uint)!bVar14 * auVar121._4_4_;
                  bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                  auVar126._8_4_ = (uint)bVar14 * auVar122._8_4_ | (uint)!bVar14 * auVar121._8_4_;
                  bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
                  auVar126._12_4_ = (uint)bVar14 * auVar122._12_4_ | (uint)!bVar14 * auVar121._12_4_
                  ;
                  bVar14 = (bool)((byte)(uVar80 >> 4) & 1);
                  auVar126._16_4_ = (uint)bVar14 * auVar122._16_4_ | (uint)!bVar14 * auVar121._16_4_
                  ;
                  bVar14 = (bool)((byte)(uVar80 >> 5) & 1);
                  auVar126._20_4_ = (uint)bVar14 * auVar122._20_4_ | (uint)!bVar14 * auVar121._20_4_
                  ;
                  bVar14 = (bool)((byte)(uVar80 >> 6) & 1);
                  auVar126._24_4_ = (uint)bVar14 * auVar122._24_4_ | (uint)!bVar14 * auVar121._24_4_
                  ;
                  bVar14 = SUB81(uVar80 >> 7,0);
                  auVar126._28_4_ = (uint)bVar14 * auVar122._28_4_ | (uint)!bVar14 * auVar121._28_4_
                  ;
                  auVar121 = vfmadd231ps_avx512vl(auVar124,auVar126,auVar186);
                  auVar121 = vfmsub231ps_avx512vl(auVar121,auVar156,auVar33);
                  auVar121 = vsubps_avx512vl(auVar121,auVar125);
                  auVar84 = vfmsub231ps_fma(auVar121,auVar162,auVar126);
                  auVar121 = vmulps_avx512vl(ZEXT1632(auVar84),auVar120);
                  auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar14 = (bool)((byte)uVar81 & 1);
                  auVar127._0_4_ = (uint)bVar14 * auVar124._0_4_ | (uint)!bVar14 * auVar121._0_4_;
                  bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar127._4_4_ = (uint)bVar14 * auVar124._4_4_ | (uint)!bVar14 * auVar121._4_4_;
                  bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar127._8_4_ = (uint)bVar14 * auVar124._8_4_ | (uint)!bVar14 * auVar121._8_4_;
                  bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar127._12_4_ = (uint)bVar14 * auVar124._12_4_ | (uint)!bVar14 * auVar121._12_4_
                  ;
                  bVar14 = (bool)((byte)(uVar81 >> 4) & 1);
                  auVar127._16_4_ = (uint)bVar14 * auVar124._16_4_ | (uint)!bVar14 * auVar121._16_4_
                  ;
                  bVar14 = (bool)((byte)(uVar81 >> 5) & 1);
                  auVar127._20_4_ = (uint)bVar14 * auVar124._20_4_ | (uint)!bVar14 * auVar121._20_4_
                  ;
                  bVar14 = (bool)((byte)(uVar81 >> 6) & 1);
                  auVar127._24_4_ = (uint)bVar14 * auVar124._24_4_ | (uint)!bVar14 * auVar121._24_4_
                  ;
                  bVar14 = SUB81(uVar81 >> 7,0);
                  auVar127._28_4_ = (uint)bVar14 * auVar124._28_4_ | (uint)!bVar14 * auVar121._28_4_
                  ;
                  auVar121 = vminps_avx(auVar127,auVar151);
                  auVar121 = vmaxps_avx(auVar121,auVar153);
                  auVar84 = vfmadd213ps_fma(auVar158,auVar121,auVar156);
                  auVar124 = vroundps_avx(ZEXT1632(auVar84),1);
                  uVar81 = vcmpps_avx512vl(ZEXT1632(auVar84),auVar124,1);
                  auVar122 = vsubps_avx512vl(auVar124,auVar160);
                  bVar14 = (bool)((byte)uVar81 & 1);
                  auVar128._0_4_ =
                       (float)((uint)bVar14 * auVar122._0_4_ | (uint)!bVar14 * auVar124._0_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar128._4_4_ =
                       (float)((uint)bVar14 * auVar122._4_4_ | (uint)!bVar14 * auVar124._4_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar128._8_4_ =
                       (float)((uint)bVar14 * auVar122._8_4_ | (uint)!bVar14 * auVar124._8_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar128._12_4_ =
                       (float)((uint)bVar14 * auVar122._12_4_ | (uint)!bVar14 * auVar124._12_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 4) & 1);
                  auVar128._16_4_ =
                       (float)((uint)bVar14 * auVar122._16_4_ | (uint)!bVar14 * auVar124._16_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 5) & 1);
                  auVar128._20_4_ =
                       (float)((uint)bVar14 * auVar122._20_4_ | (uint)!bVar14 * auVar124._20_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 6) & 1);
                  auVar128._24_4_ =
                       (float)((uint)bVar14 * auVar122._24_4_ | (uint)!bVar14 * auVar124._24_4_);
                  bVar14 = SUB81(uVar81 >> 7,0);
                  auVar128._28_4_ =
                       (float)((uint)bVar14 * auVar122._28_4_ | (uint)!bVar14 * auVar124._28_4_);
                  auVar84 = vfmsub231ps_fma(auVar121,auVar128,auVar162);
                  auVar84 = vfnmsub231ps_fma(ZEXT1632(auVar84),auVar128,auVar186);
                  auVar124 = ZEXT1632(auVar84);
                  auVar121 = vfmadd213ps_avx512vl(auVar108,auVar124,auVar176);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar124,auVar178);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar124,auVar180);
                  auVar124 = ZEXT1632(auVar84);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar124,auVar182);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar124,auVar156);
                  auVar121 = vfmadd213ps_avx512vl
                                       (auVar121,ZEXT1632(CONCAT412(auVar84._12_4_ * auVar84._12_4_,
                                                                    CONCAT48(auVar84._8_4_ *
                                                                             auVar84._8_4_,
                                                                             CONCAT44(auVar84._4_4_
                                                                                      * auVar84.
                                                  _4_4_,auVar84._0_4_ * auVar84._0_4_)))),auVar124);
                  auVar124 = vaddps_avx512vl(auVar121,auVar160);
                  auVar174._0_4_ = (int)auVar128._0_4_;
                  auVar174._4_4_ = (int)auVar128._4_4_;
                  auVar174._8_4_ = (int)auVar128._8_4_;
                  auVar174._12_4_ = (int)auVar128._12_4_;
                  auVar174._16_4_ = (int)auVar128._16_4_;
                  auVar174._20_4_ = (int)auVar128._20_4_;
                  auVar174._24_4_ = (int)auVar128._24_4_;
                  auVar174._28_4_ = (int)auVar128._28_4_;
                  auVar121 = vpslld_avx2(auVar174,0x17);
                  auVar121 = vpaddd_avx2(auVar121,auVar184);
                  auVar84 = vfmadd213ps_fma(auVar121,auVar124,auVar160);
                  auVar124 = vrcpps_avx(ZEXT1632(auVar84));
                  auVar84 = vfmsub213ps_fma(ZEXT1632(auVar84),auVar124,auVar160);
                  auVar84 = vfnmadd132ps_fma(ZEXT1632(auVar84),auVar124,auVar124);
                  auVar122 = vfnmadd213ps_avx512vl(ZEXT1632(auVar84),auVar120,auVar110);
                  auVar121._4_4_ = auVar122._4_4_ * auVar149._4_4_;
                  auVar121._0_4_ = auVar122._0_4_ * auVar149._0_4_;
                  auVar121._8_4_ = auVar122._8_4_ * auVar149._8_4_;
                  auVar121._12_4_ = auVar122._12_4_ * auVar149._12_4_;
                  auVar121._16_4_ = auVar122._16_4_ * auVar149._16_4_;
                  auVar121._20_4_ = auVar122._20_4_ * auVar149._20_4_;
                  auVar121._24_4_ = auVar122._24_4_ * auVar149._24_4_;
                  auVar121._28_4_ = auVar124._28_4_;
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var60);
                  auVar173._4_4_ = uVar1;
                  auVar173._0_4_ = uVar1;
                  auVar173._8_4_ = uVar1;
                  auVar173._12_4_ = uVar1;
                  auVar173._16_4_ = uVar1;
                  auVar173._20_4_ = uVar1;
                  auVar173._24_4_ = uVar1;
                  auVar173._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var60))[1];
                  auVar122._4_4_ = uVar1;
                  auVar122._0_4_ = uVar1;
                  auVar122._8_4_ = uVar1;
                  auVar122._12_4_ = uVar1;
                  auVar122._16_4_ = uVar1;
                  auVar122._20_4_ = uVar1;
                  auVar122._24_4_ = uVar1;
                  auVar122._28_4_ = uVar1;
                  auVar121 = vfmadd213ps_avx512vl(auVar173,auVar124,auVar122);
                  auVar121 = vmaxps_avx512vl(auVar121,ZEXT1632(auVar96));
                  auVar124 = vminps_avx(auVar121,auVar160);
                  auVar121._4_4_ = auVar124._4_4_ * auVar149._4_4_;
                  auVar121._0_4_ = auVar124._0_4_ * auVar149._0_4_;
                  auVar121._8_4_ = auVar124._8_4_ * auVar149._8_4_;
                  auVar121._12_4_ = auVar124._12_4_ * auVar149._12_4_;
                  auVar121._16_4_ = auVar124._16_4_ * auVar149._16_4_;
                  auVar121._20_4_ = auVar124._20_4_ * auVar149._20_4_;
                  auVar121._24_4_ = auVar124._24_4_ * auVar149._24_4_;
                  auVar121._28_4_ = auVar124._28_4_;
                }
              }
              *(undefined1 (*) [32])ppp_Var72 = auVar121;
              ppp_Var72 = ppp_Var72 + 4;
            }
          }
          uVar61 = (ulong)(uint)((int)uVar61 + iVar53 * 8);
        }
      }
      else if (iVar55 == 4) {
        if (iVar69 < 1) {
          iVar69 = 0;
        }
        if (iVar73 < 1) {
          iVar73 = 0;
        }
        uVar61 = 0;
        if (0 < (int)uVar59) {
          uVar61 = uVar65;
        }
        local_1b0 = CONCAT44(local_1b0._4_4_,iVar53 * 4);
        iVar55 = 0;
        auVar150._8_4_ = 0x42b0c0a5;
        auVar150._0_8_ = 0x42b0c0a542b0c0a5;
        auVar150._12_4_ = 0x42b0c0a5;
        auVar152._8_4_ = 0xc2b0c0a5;
        auVar152._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar152._12_4_ = 0xc2b0c0a5;
        auVar155._8_4_ = 0x3f000000;
        auVar155._0_8_ = 0x3f0000003f000000;
        auVar155._12_4_ = 0x3f000000;
        auVar157._8_4_ = 0x3fb8aa3b;
        auVar157._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar157._12_4_ = 0x3fb8aa3b;
        auVar159._8_4_ = 0x3f800000;
        auVar159._0_8_ = 0x3f8000003f800000;
        auVar159._12_4_ = 0x3f800000;
        auVar161._8_4_ = 0x3f318000;
        auVar161._0_8_ = 0x3f3180003f318000;
        auVar161._12_4_ = 0x3f318000;
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar175._8_4_ = 0x3ab743ce;
        auVar175._0_8_ = 0x3ab743ce3ab743ce;
        auVar175._12_4_ = 0x3ab743ce;
        auVar177._8_4_ = 0x3c088908;
        auVar177._0_8_ = 0x3c0889083c088908;
        auVar177._12_4_ = 0x3c088908;
        auVar179._8_4_ = 0x3d2aa9c1;
        auVar179._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar179._12_4_ = 0x3d2aa9c1;
        auVar181._8_4_ = 0x3e2aaaaa;
        auVar181._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar181._12_4_ = 0x3e2aaaaa;
        auVar183._8_4_ = 0x3f800000;
        auVar183._0_8_ = 0x3f8000003f800000;
        auVar183._12_4_ = 0x3f800000;
        auVar185._8_4_ = 0xb95e8083;
        auVar185._0_8_ = 0xb95e8083b95e8083;
        auVar185._12_4_ = 0xb95e8083;
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar96 = vxorps_avx512vl(auVar96,auVar96);
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        for (uVar65 = 0; uVar65 != uVar61; uVar65 = uVar65 + 1) {
          ppp_Var72 = (_func_int ***)
                      ((long)(_func_int ***)local_1f8._0_8_ + local_1b8 * uVar65 * local_1f8._16_8_)
          ;
          iVar52 = bottom_blob->w;
          sVar77 = bottom_blob->cstep;
          sVar9 = bottom_blob->elemsize;
          pvVar10 = bottom_blob->data;
          pvVar11 = (this->weight_data_tm).data;
          for (iVar71 = 0; iVar71 != iVar73; iVar71 = iVar71 + 1) {
            pp_Var12 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
            for (iVar83 = 0; iVar83 != iVar69; iVar83 = iVar83 + 1) {
              p_Var60 = pp_Var12[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var60) == 0) {
                auVar98 = ZEXT816(0) << 0x40;
              }
              else {
                auVar98 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x1b0 + (long)p_Var60) + uVar65 * 0x10);
              }
              auVar149 = ZEXT1664(auVar98);
              iVar74 = 0;
              iVar75 = *(int *)(&this->field_0xd8 + (long)p_Var60);
              if (*(int *)(&this->field_0xd8 + (long)p_Var60) < 1) {
                iVar75 = iVar74;
              }
              for (; iVar74 != iVar75; iVar74 = iVar74 + 1) {
                iVar56 = *(int *)(&this->field_0xe0 + (long)p_Var60) * iVar74 + (iVar71 - iVar64);
                if (((-1 < iVar56) &&
                    (iVar57 = iVar56 / *(int *)(&this->field_0xe8 + (long)p_Var60),
                    iVar56 % *(int *)(&this->field_0xe8 + (long)p_Var60) == 0)) && (iVar57 < iVar67)
                   ) {
                  uVar70 = *(uint *)(&this->field_0xd4 + (long)p_Var60);
                  uVar82 = 0;
                  if (0 < (int)uVar70) {
                    uVar82 = (ulong)uVar70;
                  }
                  pauVar79 = (undefined1 (*) [16])
                             ((long)pvVar11 + (long)(int)(uVar70 * iVar74) * 0x10 + (long)iVar55 * 4
                             );
                  for (uVar81 = 0; uVar82 != uVar81; uVar81 = uVar81 + 1) {
                    iVar56 = *(int *)(&this->field_0xdc + (long)p_Var60) * (int)uVar81 +
                             (iVar83 - iVar63);
                    if (((-1 < iVar56) &&
                        (iVar58 = iVar56 / *(int *)(&this->field_0xe4 + (long)p_Var60),
                        iVar56 % *(int *)(&this->field_0xe4 + (long)p_Var60) == 0)) &&
                       (iVar58 < iVar54)) {
                      auVar98 = vfmadd231ps_fma(auVar149._0_16_,
                                                *(undefined1 (*) [16])
                                                 ((long)pvVar10 +
                                                 (long)(iVar58 << 2) * 4 +
                                                 (long)iVar57 * (long)iVar52 * sVar9 +
                                                 sVar77 * uVar65 * sVar9),*pauVar79);
                      auVar149 = ZEXT1664(auVar98);
                    }
                    pauVar79 = pauVar79 + 1;
                  }
                }
              }
              auVar107 = auVar149._0_16_;
              auVar98 = auVar107;
              if (*(int *)(&this->field_0x118 + (long)p_Var60) - 1U < 6) {
                auVar98 = vmaxps_avx512vl(auVar107,auVar96);
                switch(*(int *)(&this->field_0x118 + (long)p_Var60)) {
                case 2:
                  auVar107 = vminps_avx512vl(auVar107,auVar96);
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var60);
                  auVar23._4_4_ = uVar1;
                  auVar23._0_4_ = uVar1;
                  auVar23._8_4_ = uVar1;
                  auVar23._12_4_ = uVar1;
                  auVar98 = vfmadd231ps_avx512vl(auVar98,auVar107,auVar23);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var60);
                  auVar21._4_4_ = uVar1;
                  auVar21._0_4_ = uVar1;
                  auVar21._8_4_ = uVar1;
                  auVar21._12_4_ = uVar1;
                  auVar98 = vmaxps_avx512vl(auVar107,auVar21);
                  uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var60))[1];
                  auVar22._4_4_ = uVar1;
                  auVar22._0_4_ = uVar1;
                  auVar22._8_4_ = uVar1;
                  auVar22._12_4_ = uVar1;
                  auVar98 = vminps_avx512vl(auVar98,auVar22);
                  break;
                case 4:
                  auVar20._8_4_ = 0x80000000;
                  auVar20._0_8_ = 0x8000000080000000;
                  auVar20._12_4_ = 0x80000000;
                  auVar98 = vxorps_avx512vl(auVar107,auVar20);
                  auVar98 = vminps_avx(auVar98,auVar150);
                  auVar107 = vmaxps_avx(auVar98,auVar152);
                  auVar101 = vfmadd231ps_fma(auVar155,auVar107,auVar157);
                  auVar191._0_4_ = (int)auVar101._0_4_;
                  auVar191._4_4_ = (int)auVar101._4_4_;
                  auVar191._8_4_ = (int)auVar101._8_4_;
                  auVar191._12_4_ = (int)auVar101._12_4_;
                  auVar98 = vcvtdq2ps_avx(auVar191);
                  uVar82 = vcmpps_avx512vl(auVar101,auVar98,1);
                  auVar101 = vsubps_avx512vl(auVar98,auVar159);
                  bVar14 = (bool)((byte)uVar82 & 1);
                  auVar106._0_4_ =
                       (float)((uint)bVar14 * auVar101._0_4_ | (uint)!bVar14 * auVar98._0_4_);
                  bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
                  auVar106._4_4_ =
                       (float)((uint)bVar14 * auVar101._4_4_ | (uint)!bVar14 * auVar98._4_4_);
                  bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
                  auVar106._8_4_ =
                       (float)((uint)bVar14 * auVar101._8_4_ | (uint)!bVar14 * auVar98._8_4_);
                  bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
                  auVar106._12_4_ =
                       (float)((uint)bVar14 * auVar101._12_4_ | (uint)!bVar14 * auVar98._12_4_);
                  auVar98 = vfmsub231ps_fma(auVar107,auVar106,auVar161);
                  auVar107._8_4_ = 0x395e8083;
                  auVar107._0_8_ = 0x395e8083395e8083;
                  auVar107._12_4_ = 0x395e8083;
                  auVar107 = vfmsub231ps_avx512vl(auVar98,auVar106,auVar107);
                  auVar165._0_4_ = auVar107._0_4_ * auVar107._0_4_;
                  auVar165._4_4_ = auVar107._4_4_ * auVar107._4_4_;
                  auVar165._8_4_ = auVar107._8_4_ * auVar107._8_4_;
                  auVar165._12_4_ = auVar107._12_4_ * auVar107._12_4_;
                  auVar98 = vfmadd213ps_fma(auVar84,auVar107,auVar175);
                  auVar98 = vfmadd213ps_fma(auVar98,auVar107,auVar177);
                  auVar98 = vfmadd213ps_fma(auVar98,auVar107,auVar179);
                  auVar98 = vfmadd213ps_fma(auVar98,auVar107,auVar181);
                  auVar98 = vfmadd213ps_fma(auVar98,auVar107,auVar155);
                  auVar98 = vfmadd213ps_fma(auVar98,auVar165,auVar107);
                  auVar147._0_4_ = auVar98._0_4_ + 1.0;
                  auVar147._4_4_ = auVar98._4_4_ + 1.0;
                  auVar147._8_4_ = auVar98._8_4_ + 1.0;
                  auVar147._12_4_ = auVar98._12_4_ + 1.0;
                  auVar166._0_4_ = (int)auVar106._0_4_;
                  auVar166._4_4_ = (int)auVar106._4_4_;
                  auVar166._8_4_ = (int)auVar106._8_4_;
                  auVar166._12_4_ = (int)auVar106._12_4_;
                  auVar98 = vpslld_avx(auVar166,0x17);
                  auVar98 = vpaddd_avx(auVar183,auVar98);
                  auVar107 = vfmadd213ps_fma(auVar98,auVar147,auVar159);
                  auVar98 = vrcpps_avx(auVar107);
                  auVar107 = vfmsub213ps_fma(auVar107,auVar98,auVar159);
                  auVar98 = vfnmadd132ps_fma(auVar107,auVar98,auVar98);
                  break;
                case 5:
                  auVar98 = vminps_avx(auVar107,auVar150);
                  auVar101 = vmaxps_avx(auVar98,auVar152);
                  auVar99 = vfmadd213ps_fma(auVar157,auVar101,auVar155);
                  auVar187._0_4_ = (int)auVar99._0_4_;
                  auVar187._4_4_ = (int)auVar99._4_4_;
                  auVar187._8_4_ = (int)auVar99._8_4_;
                  auVar187._12_4_ = (int)auVar99._12_4_;
                  auVar98 = vcvtdq2ps_avx(auVar187);
                  uVar82 = vcmpps_avx512vl(auVar99,auVar98,1);
                  auVar99 = vsubps_avx512vl(auVar98,auVar159);
                  bVar14 = (bool)((byte)uVar82 & 1);
                  auVar100._0_4_ =
                       (float)((uint)bVar14 * auVar99._0_4_ | (uint)!bVar14 * auVar98._0_4_);
                  bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
                  auVar100._4_4_ =
                       (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar98._4_4_);
                  bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
                  auVar100._8_4_ =
                       (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar98._8_4_);
                  bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
                  auVar100._12_4_ =
                       (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar98._12_4_);
                  auVar98 = vfmsub231ps_fma(auVar101,auVar100,auVar161);
                  auVar98 = vfnmsub231ps_fma(auVar98,auVar100,auVar185);
                  auVar169._0_4_ = auVar98._0_4_ * auVar98._0_4_;
                  auVar169._4_4_ = auVar98._4_4_ * auVar98._4_4_;
                  auVar169._8_4_ = auVar98._8_4_ * auVar98._8_4_;
                  auVar169._12_4_ = auVar98._12_4_ * auVar98._12_4_;
                  auVar101 = vfmadd213ps_avx512vl(auVar84,auVar98,auVar175);
                  auVar101 = vfmadd213ps_avx512vl(auVar101,auVar98,auVar177);
                  auVar101 = vfmadd213ps_avx512vl(auVar101,auVar98,auVar179);
                  auVar101 = vfmadd213ps_avx512vl(auVar101,auVar98,auVar181);
                  auVar101 = vfmadd213ps_avx512vl(auVar101,auVar98,auVar155);
                  auVar98 = vfmadd213ps_avx512vl(auVar101,auVar169,auVar98);
                  auVar101 = vaddps_avx512vl(auVar98,auVar159);
                  auVar170._0_4_ = (int)auVar100._0_4_;
                  auVar170._4_4_ = (int)auVar100._4_4_;
                  auVar170._8_4_ = (int)auVar100._8_4_;
                  auVar170._12_4_ = (int)auVar100._12_4_;
                  auVar98 = vpslld_avx(auVar170,0x17);
                  auVar98 = vpaddd_avx(auVar98,auVar183);
                  auVar98 = vfmadd213ps_fma(auVar98,auVar101,auVar159);
                  uVar82 = vcmpps_avx512vl(auVar98,auVar96,2);
                  auVar17._8_4_ = 0x800000;
                  auVar17._0_8_ = 0x80000000800000;
                  auVar17._12_4_ = 0x800000;
                  auVar98 = vmaxps_avx512vl(auVar98,auVar17);
                  auVar99 = vpsrld_avx(auVar98,0x17);
                  auVar188._8_4_ = 0x807fffff;
                  auVar188._0_8_ = 0x807fffff807fffff;
                  auVar188._12_4_ = 0x807fffff;
                  auVar18._8_4_ = 0x3f000000;
                  auVar18._0_8_ = 0x3f0000003f000000;
                  auVar18._12_4_ = 0x3f000000;
                  auVar98 = vpternlogd_avx512vl(auVar98,auVar188,auVar18,0xea);
                  uVar81 = vcmpps_avx512vl(auVar98,auVar85,1);
                  auVar101 = vaddps_avx512vl(auVar98,auVar86);
                  auVar98 = vaddps_avx512vl(auVar101,auVar98);
                  bVar14 = (bool)((byte)uVar81 & 1);
                  auVar102._0_4_ =
                       (float)((uint)bVar14 * auVar98._0_4_ | (uint)!bVar14 * auVar101._0_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar102._4_4_ =
                       (float)((uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar101._4_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar102._8_4_ =
                       (float)((uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar101._8_4_);
                  bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar102._12_4_ =
                       (float)((uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar101._12_4_);
                  auVar163._0_4_ = auVar102._0_4_ * auVar102._0_4_;
                  auVar163._4_4_ = auVar102._4_4_ * auVar102._4_4_;
                  auVar163._8_4_ = auVar102._8_4_ * auVar102._8_4_;
                  auVar163._12_4_ = auVar102._12_4_ * auVar102._12_4_;
                  auVar98 = vfmadd213ps_avx512vl(auVar87,auVar102,auVar88);
                  auVar98 = vfmadd213ps_avx512vl(auVar98,auVar102,auVar89);
                  auVar98 = vfmadd213ps_avx512vl(auVar98,auVar102,auVar90);
                  auVar98 = vfmadd213ps_avx512vl(auVar98,auVar102,auVar91);
                  auVar98 = vfmadd213ps_avx512vl(auVar98,auVar102,auVar92);
                  auVar98 = vfmadd213ps_avx512vl(auVar98,auVar102,auVar93);
                  auVar98 = vfmadd213ps_avx512vl(auVar98,auVar102,auVar94);
                  auVar98 = vfmadd213ps_avx512vl(auVar98,auVar102,auVar95);
                  auVar101 = vmulps_avx512vl(auVar163,auVar102);
                  auVar101 = vmulps_avx512vl(auVar101,auVar98);
                  auVar19._8_4_ = 0xffffff82;
                  auVar19._0_8_ = 0xffffff82ffffff82;
                  auVar19._12_4_ = 0xffffff82;
                  auVar98 = vpaddd_avx512vl(auVar99,auVar19);
                  auVar98 = vcvtdq2ps_avx(auVar98);
                  auVar99 = vsubps_avx512vl(auVar98,auVar159);
                  bVar14 = (bool)((byte)uVar81 & 1);
                  auVar103._0_4_ = (uint)bVar14 * auVar99._0_4_ | (uint)!bVar14 * auVar98._0_4_;
                  bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar103._4_4_ = (uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar98._4_4_;
                  bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar103._8_4_ = (uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar98._8_4_;
                  bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar103._12_4_ = (uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar98._12_4_;
                  auVar98 = vfmadd231ps_avx512vl(auVar101,auVar103,auVar185);
                  auVar98 = vfmsub231ps_avx512vl(auVar98,auVar155,auVar163);
                  auVar98 = vsubps_avx512vl(auVar98,auVar102);
                  auVar98 = vfnmadd231ps_fma(auVar98,auVar161,auVar103);
                  auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar14 = (bool)((byte)uVar82 & 1);
                  auVar104._0_4_ =
                       (uint)bVar14 * auVar101._0_4_ |
                       (uint)!bVar14 * (int)(auVar98._0_4_ + auVar98._0_4_);
                  bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
                  auVar104._4_4_ =
                       (uint)bVar14 * auVar101._4_4_ |
                       (uint)!bVar14 * (int)(auVar98._4_4_ + auVar98._4_4_);
                  bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
                  auVar104._8_4_ =
                       (uint)bVar14 * auVar101._8_4_ |
                       (uint)!bVar14 * (int)(auVar98._8_4_ + auVar98._8_4_);
                  bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
                  auVar104._12_4_ =
                       (uint)bVar14 * auVar101._12_4_ |
                       (uint)!bVar14 * (int)(auVar98._12_4_ + auVar98._12_4_);
                  auVar98 = vminps_avx(auVar104,auVar150);
                  auVar101 = vmaxps_avx(auVar98,auVar152);
                  auVar99 = vfmadd213ps_fma(auVar157,auVar101,auVar155);
                  auVar189._0_4_ = (int)auVar99._0_4_;
                  auVar189._4_4_ = (int)auVar99._4_4_;
                  auVar189._8_4_ = (int)auVar99._8_4_;
                  auVar189._12_4_ = (int)auVar99._12_4_;
                  auVar98 = vcvtdq2ps_avx(auVar189);
                  uVar82 = vcmpps_avx512vl(auVar99,auVar98,1);
                  auVar99 = vsubps_avx512vl(auVar98,auVar159);
                  bVar14 = (bool)((byte)uVar82 & 1);
                  auVar105._0_4_ =
                       (float)((uint)bVar14 * auVar99._0_4_ | (uint)!bVar14 * auVar98._0_4_);
                  bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
                  auVar105._4_4_ =
                       (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar98._4_4_);
                  bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
                  auVar105._8_4_ =
                       (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar98._8_4_);
                  bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
                  auVar105._12_4_ =
                       (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar98._12_4_);
                  auVar98 = vfmsub231ps_fma(auVar101,auVar105,auVar161);
                  auVar98 = vfnmsub231ps_fma(auVar98,auVar105,auVar185);
                  auVar171._0_4_ = auVar98._0_4_ * auVar98._0_4_;
                  auVar171._4_4_ = auVar98._4_4_ * auVar98._4_4_;
                  auVar171._8_4_ = auVar98._8_4_ * auVar98._8_4_;
                  auVar171._12_4_ = auVar98._12_4_ * auVar98._12_4_;
                  auVar101 = vfmadd213ps_avx512vl(auVar84,auVar98,auVar175);
                  auVar101 = vfmadd213ps_avx512vl(auVar101,auVar98,auVar177);
                  auVar101 = vfmadd213ps_avx512vl(auVar101,auVar98,auVar179);
                  auVar101 = vfmadd213ps_avx512vl(auVar101,auVar98,auVar181);
                  auVar101 = vfmadd213ps_avx512vl(auVar101,auVar98,auVar155);
                  auVar98 = vfmadd213ps_avx512vl(auVar101,auVar171,auVar98);
                  auVar101 = vaddps_avx512vl(auVar98,auVar159);
                  auVar164._0_4_ = (int)auVar105._0_4_;
                  auVar164._4_4_ = (int)auVar105._4_4_;
                  auVar164._8_4_ = (int)auVar105._8_4_;
                  auVar164._12_4_ = (int)auVar105._12_4_;
                  auVar98 = vpslld_avx(auVar164,0x17);
                  auVar98 = vpaddd_avx(auVar183,auVar98);
                  auVar101 = vfmadd213ps_fma(auVar98,auVar101,auVar159);
                  auVar98 = vrcpps_avx(auVar101);
                  auVar190._0_4_ = auVar98._0_4_ + auVar98._0_4_;
                  auVar190._4_4_ = auVar98._4_4_ + auVar98._4_4_;
                  auVar190._8_4_ = auVar98._8_4_ + auVar98._8_4_;
                  auVar190._12_4_ = auVar98._12_4_ + auVar98._12_4_;
                  auVar101 = vfmsub213ps_avx512vl(auVar101,auVar190,auVar97);
                  auVar98 = vfnmadd213ps_fma(auVar101,auVar98,auVar190);
                  auVar98 = vfmsub213ps_fma(auVar98,auVar107,auVar107);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var60);
                  auVar99._4_4_ = uVar1;
                  auVar99._0_4_ = uVar1;
                  auVar99._8_4_ = uVar1;
                  auVar99._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var60))[1];
                  auVar101._4_4_ = uVar1;
                  auVar101._0_4_ = uVar1;
                  auVar101._8_4_ = uVar1;
                  auVar101._12_4_ = uVar1;
                  auVar98 = vfmadd213ps_avx512vl(auVar99,auVar107,auVar101);
                  auVar98 = vmaxps_avx512vl(auVar98,auVar96);
                  auVar107 = vminps_avx(auVar98,auVar159);
                  auVar98._0_4_ = auVar107._0_4_ * auVar149._0_4_;
                  auVar98._4_4_ = auVar107._4_4_ * auVar149._4_4_;
                  auVar98._8_4_ = auVar107._8_4_ * auVar149._8_4_;
                  auVar98._12_4_ = auVar107._12_4_ * auVar149._12_4_;
                }
              }
              *(undefined1 (*) [16])ppp_Var72 = auVar98;
              ppp_Var72 = ppp_Var72 + 2;
            }
          }
          iVar55 = iVar55 + iVar53 * 4;
        }
      }
    }
    else {
      uVar61 = (long)iVar52 / (long)iVar53;
      uVar65 = (long)*(int *)(&this->field_0xd0 + (long)p_Var60) / (long)iVar53;
      if (opt->use_packing_layout == true) {
        iVar54 = 0x10;
        uVar59 = 0x10;
        if ((uVar61 & 0xf) != 0) {
          if ((uVar61 & 7) == 0) {
            iVar54 = 8;
          }
          else {
            iVar54 = (uint)((uVar61 & 3) == 0) * 3 + 1;
          }
        }
        if ((uVar65 & 0xf) != 0) {
          if ((uVar65 & 7) == 0) {
            uVar59 = 8;
          }
          else {
            uVar59 = (uint)((uVar65 & 3) == 0) * 3 + 1;
          }
        }
      }
      else {
        iVar54 = 1;
        uVar59 = 1;
      }
      piVar8 = bottom_blob->refcount;
      local_158.data = bottom_blob->data;
      local_158.refcount = bottom_blob->refcount;
      local_158.elemsize = bottom_blob->elemsize;
      local_158.elempack = bottom_blob->elempack;
      local_158.allocator = bottom_blob->allocator;
      local_158.dims = bottom_blob->dims;
      local_158.w = bottom_blob->w;
      local_158.h = bottom_blob->h;
      local_158.d = bottom_blob->d;
      local_158.c = bottom_blob->c;
      local_158.cstep = bottom_blob->cstep;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      if (iVar54 < iVar55) {
        opt_p.lightmode = opt->lightmode;
        opt_p._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_p.num_threads = opt->num_threads;
        opt_p.workspace_allocator = opt->workspace_allocator;
        opt_p.openmp_blocktime = opt->openmp_blocktime;
        opt_p.use_winograd_convolution = opt->use_winograd_convolution;
        opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_p.use_int8_inference = opt->use_int8_inference;
        opt_p.use_vulkan_compute = opt->use_vulkan_compute;
        opt_p.use_bf16_storage = opt->use_bf16_storage;
        opt_p.use_fp16_packed = opt->use_fp16_packed;
        opt_p.use_fp16_storage = opt->use_fp16_storage;
        opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_p.use_int8_packed = opt->use_int8_packed;
        opt_p.use_int8_storage = opt->use_int8_storage;
        opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_p.use_packing_layout = opt->use_packing_layout;
        opt_p.use_shader_pack8 = opt->use_shader_pack8;
        opt_p.use_subgroup_basic = opt->use_subgroup_basic;
        opt_p.use_subgroup_vote = opt->use_subgroup_vote;
        opt_p.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_p.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_p.use_image_storage = opt->use_image_storage;
        opt_p.use_tensor_storage = opt->use_tensor_storage;
        opt_p.use_reserved_0 = opt->use_reserved_0;
        opt_p.flush_denormals = opt->flush_denormals;
        opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_p.use_shader_local_memory = opt->use_shader_local_memory;
        opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_p.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_p.use_reserved_7 = opt->use_reserved_7;
        opt_p.use_reserved_8 = opt->use_reserved_8;
        opt_p.use_reserved_9 = opt->use_reserved_9;
        opt_p.use_reserved_10 = opt->use_reserved_10;
        opt_p.use_reserved_11 = opt->use_reserved_11;
        opt_p.blob_allocator = opt->workspace_allocator;
        convert_packing(bottom_blob,&local_158,iVar54,&opt_p);
      }
      sVar9 = local_1b8;
      piVar8 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
      opt_p.blob_allocator = (Allocator *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
      opt_p.lightmode = (bool)local_1f8[0];
      opt_p._1_3_ = local_1f8._1_3_;
      opt_p.num_threads = local_1f8._4_4_;
      opt_p.workspace_allocator = (Allocator *)local_1f8._16_8_;
      opt_p.openmp_blocktime = local_1f8._24_4_;
      opt_p.use_bf16_storage = (bool)local_1f8[0x20];
      opt_p.use_fp16_packed = (bool)local_1f8[0x21];
      opt_p.use_fp16_storage = (bool)local_1f8[0x22];
      opt_p.use_fp16_arithmetic = (bool)local_1f8[0x23];
      opt_p.use_int8_packed = (bool)local_1f8[0x24];
      opt_p.use_int8_storage = (bool)local_1f8[0x25];
      opt_p.use_int8_arithmetic = (bool)local_1f8[0x26];
      opt_p.use_packing_layout = (bool)local_1f8[0x27];
      opt_p._44_4_ = local_1f8._44_4_;
      opt_p._40_4_ = local_1f8._40_4_;
      opt_p.flush_denormals = local_1f8._48_4_;
      opt_p.use_local_pool_allocator = (bool)local_1f8[0x34];
      opt_p.use_shader_local_memory = (bool)local_1f8[0x35];
      opt_p.use_cooperative_matrix = (bool)local_1f8[0x36];
      opt_p.use_winograd23_convolution = (bool)local_1f8[0x37];
      opt_p.use_winograd43_convolution = (bool)(undefined1)local_1c0;
      opt_p.use_winograd63_convolution = (bool)local_1c0._1_1_;
      opt_p.use_a53_a55_optimized_kernel = (bool)local_1c0._2_1_;
      opt_p.use_reserved_7 = (bool)local_1c0._3_1_;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      if ((uVar59 < uVar70) &&
         ((Mat::create((Mat *)&opt_p,iVar69,iVar73,
                       *(int *)(&this->field_0xd0 +
                               (long)this->_vptr_DeconvolutionDepthWise_x86_avx512[-3]) /
                       (int)uVar59,(ulong)uVar59 * (sVar77 / uVar70),uVar59,opt->workspace_allocator
                      ), opt_p._0_8_ == 0 || ((long)(int)opt_p._56_4_ * sVar9 == 0)))) {
        iVar54 = -100;
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_p._32_8_ == 0) {
              free((void *)opt_p._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
            }
          }
        }
        if (local_158.refcount != (int *)0x0) {
          LOCK();
          *local_158.refcount = *local_158.refcount + -1;
          UNLOCK();
          if (*local_158.refcount == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
              free(local_158.data);
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_003d524d;
      }
      iVar55 = 0;
      iVar67 = 0;
      for (lVar62 = 0;
          lVar62 < *(int *)(&this->field_0x114 +
                           (long)this->_vptr_DeconvolutionDepthWise_x86_avx512[-3]);
          lVar62 = lVar62 + 1) {
        m.c = (int)uVar61 / iVar54;
        m.data = (void *)((long)(iVar55 / iVar54) * local_158.cstep * local_158.elemsize +
                         (long)local_158.data);
        m.refcount = (int *)0x0;
        m.elemsize = local_158.elemsize;
        m.elempack = local_158.elempack;
        m.allocator = local_158.allocator;
        m.cstep = ((long)local_158.d * local_158.elemsize * (long)local_158.h * (long)local_158.w +
                   0xf & 0xfffffffffffffff0) / local_158.elemsize;
        m.dims = local_158.dims;
        m.w = local_158.w;
        m.h = local_158.h;
        m.d = local_158.d;
        m_1.c = (int)uVar65 / (int)uVar59;
        m_1.data = (void *)((long)(iVar67 / (int)uVar59) * sVar9 * (long)opt_p.workspace_allocator +
                           opt_p._0_8_);
        m_1.refcount = (int *)0x0;
        m_1.elemsize = (size_t)opt_p.workspace_allocator;
        m_1.elempack = opt_p.openmp_blocktime;
        m_1.allocator = (Allocator *)opt_p._32_8_;
        m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                     (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU &
                    0xfffffffffffffff0) / (ulong)opt_p.workspace_allocator;
        m_1._40_8_ = opt_p._40_8_;
        m_1._48_8_ = opt_p._48_8_;
        pLVar13 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar62];
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        opt_g.workspace_allocator = opt->workspace_allocator;
        opt_g.openmp_blocktime = opt->openmp_blocktime;
        opt_g.use_winograd_convolution = opt->use_winograd_convolution;
        opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_g.use_int8_inference = opt->use_int8_inference;
        opt_g.use_vulkan_compute = opt->use_vulkan_compute;
        opt_g.use_bf16_storage = opt->use_bf16_storage;
        opt_g.use_fp16_packed = opt->use_fp16_packed;
        opt_g.use_fp16_storage = opt->use_fp16_storage;
        opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_g.use_int8_packed = opt->use_int8_packed;
        opt_g.use_int8_storage = opt->use_int8_storage;
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g.use_shader_pack8 = opt->use_shader_pack8;
        opt_g.use_subgroup_basic = opt->use_subgroup_basic;
        opt_g.use_subgroup_vote = opt->use_subgroup_vote;
        opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_g.use_image_storage = opt->use_image_storage;
        opt_g.use_tensor_storage = opt->use_tensor_storage;
        opt_g.use_reserved_0 = opt->use_reserved_0;
        opt_g.flush_denormals = opt->flush_denormals;
        opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_g.use_shader_local_memory = opt->use_shader_local_memory;
        opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_g.use_reserved_7 = opt->use_reserved_7;
        opt_g.use_reserved_8 = opt->use_reserved_8;
        opt_g.use_reserved_9 = opt->use_reserved_9;
        opt_g.use_reserved_10 = opt->use_reserved_10;
        opt_g.use_reserved_11 = opt->use_reserved_11;
        opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
        (*pLVar13->_vptr_Layer[7])(pLVar13,&m,&m_1,&opt_g);
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (m.refcount != (int *)0x0) {
          LOCK();
          *m.refcount = *m.refcount + -1;
          UNLOCK();
          if (*m.refcount == 0) {
            if (m.allocator == (Allocator *)0x0) {
              free(m.data);
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar67 = iVar67 + (int)uVar65;
        iVar55 = iVar55 + (int)uVar61;
      }
      if (uVar59 < uVar70) {
        convert_packing((Mat *)&opt_p,(Mat *)local_1f8,uVar70,opt);
      }
      else {
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
          UNLOCK();
        }
        piVar8 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if ((Allocator *)local_1f8._32_8_ == (Allocator *)0x0) {
              free((void *)local_1f8._0_8_);
            }
            else {
              (*(*(_func_int ***)local_1f8._32_8_)[3])();
            }
          }
        }
        uVar51 = opt_p._56_8_;
        local_1f8[0] = opt_p.lightmode;
        local_1f8._1_3_ = opt_p._1_3_;
        local_1f8._4_4_ = opt_p.num_threads;
        local_1f8._8_4_ = SUB84(opt_p.blob_allocator,0);
        local_1f8._12_4_ = (undefined4)((ulong)opt_p.blob_allocator >> 0x20);
        local_1f8._16_8_ = opt_p.workspace_allocator;
        local_1f8._24_4_ = opt_p.openmp_blocktime;
        local_1f8[0x20] = opt_p.use_bf16_storage;
        local_1f8[0x21] = opt_p.use_fp16_packed;
        local_1f8[0x22] = opt_p.use_fp16_storage;
        local_1f8[0x23] = opt_p.use_fp16_arithmetic;
        local_1f8[0x24] = opt_p.use_int8_packed;
        local_1f8[0x25] = opt_p.use_int8_storage;
        local_1f8[0x26] = opt_p.use_int8_arithmetic;
        local_1f8[0x27] = opt_p.use_packing_layout;
        local_1f8._40_4_ = opt_p._40_4_;
        local_1f8._44_4_ = opt_p._44_4_;
        local_1f8._48_4_ = opt_p.flush_denormals;
        local_1f8[0x34] = opt_p.use_local_pool_allocator;
        local_1f8[0x35] = opt_p.use_shader_local_memory;
        local_1f8[0x36] = opt_p.use_cooperative_matrix;
        local_1f8[0x37] = opt_p.use_winograd23_convolution;
        local_1c0._0_1_ = opt_p.use_winograd43_convolution;
        local_1c0._1_1_ = opt_p.use_winograd63_convolution;
        local_1c0._2_1_ = opt_p.use_a53_a55_optimized_kernel;
        local_1c0._3_1_ = opt_p.use_reserved_7;
        local_1b8 = sVar9;
        opt_p._56_8_ = uVar51;
      }
      if (opt_p.blob_allocator != (Allocator *)0x0) {
        LOCK();
        *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
             *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
        UNLOCK();
        if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
          if (opt_p._32_8_ == 0) {
            free((void *)opt_p._0_8_);
          }
          else {
            (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
          }
        }
      }
      if (local_158.refcount != (int *)0x0) {
        LOCK();
        *local_158.refcount = *local_158.refcount + -1;
        UNLOCK();
        if (*local_158.refcount == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            free(local_158.data);
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    DeconvolutionDepthWise::cut_padding
              ((DeconvolutionDepthWise *)
               ((long)&this->_vptr_DeconvolutionDepthWise_x86_avx512 +
               (long)this->_vptr_DeconvolutionDepthWise_x86_avx512[-3]),(Mat *)local_1f8,top_blob,
               opt);
    if ((top_blob->data != (void *)0x0) && (iVar54 = 0, (long)top_blob->c * top_blob->cstep != 0))
    goto LAB_003d524d;
  }
  iVar54 = -100;
LAB_003d524d:
  piVar8 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_1f8._32_8_ == (Allocator *)0x0) {
        free((void *)local_1f8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_1f8._32_8_)[3])();
      }
    }
  }
  return iVar54;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}